

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution1D_x86_avx::forward
          (Convolution1D_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined4 uVar11;
  void *pvVar12;
  void *pvVar13;
  size_t sVar14;
  size_t sVar15;
  void *pvVar16;
  size_t sVar17;
  int iVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  int iVar22;
  int *piVar23;
  undefined1 auVar24 [32];
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  float *pfVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  float *pfVar36;
  float *pfVar37;
  int iVar38;
  int iVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  uint uVar43;
  int iVar44;
  uint uVar45;
  long lVar46;
  long lVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  float *pfVar51;
  int iVar52;
  ulong uVar53;
  ulong uVar54;
  long lVar55;
  ulong uVar56;
  ulong uVar57;
  float *pfVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  ulong uVar62;
  undefined4 *puVar63;
  float *pfVar64;
  float *pfVar65;
  ulong uVar66;
  undefined4 *puVar67;
  int iVar68;
  ulong uVar69;
  long lVar70;
  long lVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined4 extraout_XMM0_Db_00;
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar76 [64];
  undefined4 extraout_XMM0_Dd;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 extraout_var_00 [60];
  float fVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar107 [28];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar116;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar115 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  float fVar143;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar154 [32];
  __m128 pos;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [64];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar186;
  undefined1 auVar187 [16];
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  undefined1 auVar188 [32];
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  undefined1 (*local_218) [32];
  int local_210;
  long local_200;
  int local_1f8;
  long local_1d0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  int local_190;
  int local_138;
  Mat local_88;
  ulong local_38;
  undefined1 auVar114 [32];
  
  uVar30 = bottom_blob->elemsize;
  iVar7 = bottom_blob->elempack;
  iVar8 = (this->super_Convolution1D).kernel_w;
  iVar9 = (this->super_Convolution1D).dilation_w;
  local_88.cstep = 0;
  local_88.data = (void *)0x0;
  local_88.refcount._0_4_ = 0;
  local_88.refcount._4_4_ = 0;
  local_88.elemsize._0_4_ = 0;
  local_88.elemsize._4_4_ = 0;
  local_88.elempack = 0;
  local_88.allocator = (Allocator *)0x0;
  local_88.dims = 0;
  local_88.w = 0;
  local_88.h = 0;
  local_88.d = 0;
  local_88.c = 0;
  Convolution1D::make_padding(&this->super_Convolution1D,bottom_blob,&local_88,opt);
  local_190 = -100;
  if ((local_88.data != (void *)0x0) && ((long)local_88.c * local_88.cstep != 0)) {
    uVar45 = (this->super_Convolution1D).num_output;
    if (opt->use_packing_layout == true) {
      lVar40 = (ulong)((uVar45 & 3) == 0) * 3 + 1;
      if ((uVar45 & 7) == 0) {
        lVar40 = 8;
      }
    }
    else {
      lVar40 = 1;
    }
    Mat::create(top_blob,(local_88.w + ~((iVar8 + -1) * iVar9)) /
                         (this->super_Convolution1D).stride_w + 1,(int)uVar45 / (int)lVar40,
                lVar40 * (uVar30 / (ulong)(long)iVar7),(int)lVar40,opt->blob_allocator);
    iVar7 = local_88.elempack;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar8 = (this->super_Convolution1D).dilation_w;
      lVar70 = (long)iVar8;
      iVar9 = (this->super_Convolution1D).stride_w;
      uVar45 = (this->super_Convolution1D).kernel_w;
      iVar10 = (this->super_Convolution1D).activation_type;
      lVar46 = (long)local_88.elempack;
      lVar40 = (long)local_88.h;
      iVar38 = local_88.w * local_88.elempack;
      local_38 = (ulong)top_blob->w;
      uVar29 = (long)top_blob->h * (long)top_blob->elempack;
      lVar55 = (long)top_blob->elempack * local_38;
      pvVar12 = (this->super_Convolution1D).bias_data.data;
      iVar50 = (int)uVar29;
      uVar30 = (long)((ulong)(uint)(iVar50 >> 0x1f) << 0x20 | uVar29 & 0xffffffff) / 8;
      iVar25 = iVar8 * 8;
      lVar47 = (long)iVar38;
      lVar41 = (long)(iVar8 * 4);
      iVar22 = iVar38 * 2;
      iVar8 = iVar38 * 3;
      iVar26 = iVar38 * 4;
      iVar18 = iVar38 * 5;
      iVar27 = iVar38 * 6;
      iVar38 = iVar38 * 7;
      iVar39 = (int)lVar55;
      uVar56 = 0;
      uVar69 = (ulong)uVar45;
      if ((int)uVar45 < 1) {
        uVar69 = uVar56;
      }
      iVar49 = (int)uVar30;
      uVar53 = 0;
      if (0 < iVar49) {
        uVar53 = uVar30 & 0xffffffff;
      }
      lVar71 = lVar70 * 4;
      auVar76 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar180 = ZEXT3264(CONCAT428(0x3f000000,
                                    CONCAT424(0x3f000000,
                                              CONCAT420(0x3f000000,
                                                        CONCAT416(0x3f000000,
                                                                  CONCAT412(0x3f000000,
                                                                            CONCAT48(0x3f000000,
                                                                                                                                                                          
                                                  0x3f0000003f000000)))))));
      auVar142._8_4_ = 0x3f800000;
      auVar142._0_8_ = 0x3f8000003f800000;
      auVar142._12_4_ = 0x3f800000;
      auVar142._16_4_ = 0x3f800000;
      auVar142._20_4_ = 0x3f800000;
      auVar142._24_4_ = 0x3f800000;
      auVar142._28_4_ = 0x3f800000;
      lVar1 = (long)iVar9 * 4;
      auVar167._8_4_ = 0x3f800000;
      auVar167._0_8_ = 0x3f8000003f800000;
      auVar167._12_4_ = 0x3f800000;
      for (; iVar68 = (int)uVar69, uVar56 != uVar53; uVar56 = uVar56 + 1) {
        uVar45 = top_blob->w;
        iVar68 = top_blob->elempack;
        local_218 = (undefined1 (*) [32])
                    ((long)(int)((long)((ulong)(uint)((int)(uVar56 * 8) >> 0x1f) << 0x20 |
                                       uVar56 * 8 & 0xffffffff) / (long)iVar68) * (long)(int)uVar45
                     * top_blob->elemsize + (long)top_blob->data);
        lVar59 = (long)local_88.h * (long)local_88.elempack;
        local_200 = 0;
        uVar30 = 0;
        if (0 < (int)uVar45) {
          uVar30 = (ulong)uVar45;
        }
        iVar48 = 0;
        lVar60 = lVar47 * 4;
        for (uVar66 = 0; uVar66 != uVar30; uVar66 = uVar66 + 1) {
          fVar148 = 0.0;
          fVar149 = 0.0;
          fVar143 = 0.0;
          fVar147 = 0.0;
          fVar150 = 0.0;
          fVar151 = 0.0;
          fVar152 = 0.0;
          fVar153 = 0.0;
          fVar198 = 0.0;
          fVar199 = 0.0;
          fVar196 = 0.0;
          fVar197 = 0.0;
          fVar200 = 0.0;
          fVar201 = 0.0;
          fVar202 = 0.0;
          fVar203 = 0.0;
          if (pvVar12 != (void *)0x0) {
            pfVar51 = (float *)((long)pvVar12 + uVar56 * 0x20);
            fVar196 = *pfVar51;
            fVar197 = pfVar51[1];
            fVar198 = pfVar51[2];
            fVar199 = pfVar51[3];
            fVar200 = pfVar51[4];
            fVar201 = pfVar51[5];
            fVar202 = pfVar51[6];
            fVar203 = pfVar51[7];
          }
          pfVar51 = (float *)((this->weight_data_tm).cstep * uVar56 *
                              (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          iVar28 = local_88.elempack * iVar9 * (int)uVar66;
          lVar42 = (long)local_88.w *
                   CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
          lVar61 = (long)local_88.data + lVar60;
          pfVar65 = (float *)((long)local_88.data + local_200);
          uVar54 = 0;
          fVar94 = 0.0;
          fVar95 = 0.0;
          fVar77 = 0.0;
          fVar93 = 0.0;
          fVar96 = 0.0;
          fVar97 = 0.0;
          fVar98 = 0.0;
          fVar99 = 0.0;
          fVar190 = 0.0;
          fVar191 = 0.0;
          fVar186 = 0.0;
          fVar189 = 0.0;
          fVar192 = 0.0;
          fVar193 = 0.0;
          fVar194 = 0.0;
          fVar195 = 0.0;
          while( true ) {
            local_210 = (int)lVar59;
            if (local_210 <= (int)((uint)uVar54 | 7)) break;
            lVar31 = (int)((long)((ulong)(uint)((int)(uint)uVar54 >> 0x1f) << 0x20 |
                                 uVar54 & 0xffffffff) / (long)local_88.elempack) * lVar42;
            if (local_88.elempack == 8) {
              pfVar32 = (float *)((long)local_88.data + lVar31 + (long)iVar48 * 4);
              pfVar36 = pfVar51;
              uVar62 = uVar69;
              while (iVar52 = (int)uVar62, uVar62 = (ulong)(iVar52 - 1), iVar52 != 0) {
                fVar2 = *pfVar32;
                fVar3 = pfVar32[1];
                fVar116 = fVar203 + fVar2;
                fVar4 = pfVar32[2];
                fVar5 = pfVar32[3];
                fVar203 = pfVar32[4];
                fVar6 = pfVar32[5];
                in_ZMM4 = ZEXT3264(CONCAT428(fVar6,CONCAT424(fVar6,CONCAT420(fVar6,CONCAT416(fVar6,
                                                  CONCAT412(fVar6,CONCAT48(fVar6,CONCAT44(fVar6,
                                                  fVar6))))))));
                fVar196 = fVar203 * pfVar36[0x20] + fVar196 + fVar2 * *pfVar36;
                fVar197 = fVar203 * pfVar36[0x21] + fVar197 + fVar2 * pfVar36[1];
                fVar198 = fVar203 * pfVar36[0x22] + fVar198 + fVar2 * pfVar36[2];
                fVar199 = fVar203 * pfVar36[0x23] + fVar199 + fVar2 * pfVar36[3];
                fVar200 = fVar203 * pfVar36[0x24] + fVar200 + fVar2 * pfVar36[4];
                fVar201 = fVar203 * pfVar36[0x25] + fVar201 + fVar2 * pfVar36[5];
                fVar202 = fVar203 * pfVar36[0x26] + fVar202 + fVar2 * pfVar36[6];
                fVar203 = fVar203 + fVar116;
                fVar186 = fVar186 + fVar3 * pfVar36[8] + fVar6 * pfVar36[0x28];
                fVar189 = fVar189 + fVar3 * pfVar36[9] + fVar6 * pfVar36[0x29];
                fVar190 = fVar190 + fVar3 * pfVar36[10] + fVar6 * pfVar36[0x2a];
                fVar191 = fVar191 + fVar3 * pfVar36[0xb] + fVar6 * pfVar36[0x2b];
                fVar192 = fVar192 + fVar3 * pfVar36[0xc] + fVar6 * pfVar36[0x2c];
                fVar193 = fVar193 + fVar3 * pfVar36[0xd] + fVar6 * pfVar36[0x2d];
                fVar194 = fVar194 + fVar3 * pfVar36[0xe] + fVar6 * pfVar36[0x2e];
                fVar195 = fVar195 + fVar3 + fVar116;
                fVar2 = pfVar32[6];
                fVar3 = pfVar32[7];
                in_ZMM3 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3 * pfVar36[0x3e],
                                                             CONCAT420(fVar3 * pfVar36[0x3d],
                                                                       CONCAT416(fVar3 * pfVar36[
                                                  0x3c],CONCAT412(fVar3 * pfVar36[0x3b],
                                                                  CONCAT48(fVar3 * pfVar36[0x3a],
                                                                           CONCAT44(fVar3 * pfVar36[
                                                  0x39],fVar3 * pfVar36[0x38]))))))));
                fVar77 = fVar4 * pfVar36[0x10] + fVar77 + fVar2 * pfVar36[0x30];
                fVar93 = fVar4 * pfVar36[0x11] + fVar93 + fVar2 * pfVar36[0x31];
                fVar94 = fVar4 * pfVar36[0x12] + fVar94 + fVar2 * pfVar36[0x32];
                fVar95 = fVar4 * pfVar36[0x13] + fVar95 + fVar2 * pfVar36[0x33];
                fVar96 = fVar4 * pfVar36[0x14] + fVar96 + fVar2 * pfVar36[0x34];
                fVar97 = fVar4 * pfVar36[0x15] + fVar97 + fVar2 * pfVar36[0x35];
                fVar98 = fVar4 * pfVar36[0x16] + fVar98 + fVar2 * pfVar36[0x36];
                fVar99 = fVar4 + fVar99 + fVar2;
                fVar143 = fVar5 * pfVar36[0x18] + fVar143 + fVar3 * pfVar36[0x38];
                fVar147 = fVar5 * pfVar36[0x19] + fVar147 + fVar3 * pfVar36[0x39];
                fVar148 = fVar5 * pfVar36[0x1a] + fVar148 + fVar3 * pfVar36[0x3a];
                fVar149 = fVar5 * pfVar36[0x1b] + fVar149 + fVar3 * pfVar36[0x3b];
                fVar150 = fVar5 * pfVar36[0x1c] + fVar150 + fVar3 * pfVar36[0x3c];
                fVar151 = fVar5 * pfVar36[0x1d] + fVar151 + fVar3 * pfVar36[0x3d];
                fVar152 = fVar5 * pfVar36[0x1e] + fVar152 + fVar3 * pfVar36[0x3e];
                fVar153 = fVar5 + fVar153 + fVar3;
                pfVar36 = pfVar36 + 0x40;
                pfVar32 = pfVar32 + iVar25;
              }
              pfVar51 = pfVar51 + uVar69 * 0x40;
            }
            else {
              pfVar32 = (float *)((long)local_88.data + lVar31 + (long)iVar28 * 4);
            }
            if (local_88.elempack == 4) {
              pfVar37 = pfVar32 + 3;
              uVar62 = uVar69;
              pfVar36 = pfVar51;
              while (iVar52 = (int)uVar62, uVar62 = (ulong)(iVar52 - 1), iVar52 != 0) {
                fVar2 = pfVar37[-3];
                fVar3 = pfVar37[-2];
                fVar116 = fVar203 + fVar2;
                fVar4 = pfVar37[-1];
                fVar5 = *pfVar37;
                fVar143 = fVar5 * pfVar36[0x18] + fVar143;
                fVar147 = fVar5 * pfVar36[0x19] + fVar147;
                fVar148 = fVar5 * pfVar36[0x1a] + fVar148;
                fVar149 = fVar5 * pfVar36[0x1b] + fVar149;
                fVar150 = fVar5 * pfVar36[0x1c] + fVar150;
                fVar151 = fVar5 * pfVar36[0x1d] + fVar151;
                fVar152 = fVar5 * pfVar36[0x1e] + fVar152;
                in_ZMM4 = ZEXT3264(CONCAT428(fVar5 + fVar153,
                                             CONCAT424(fVar152,CONCAT420(fVar151,CONCAT416(fVar150,
                                                  CONCAT412(fVar149,CONCAT48(fVar148,CONCAT44(
                                                  fVar147,fVar143))))))));
                fVar203 = pfVar37[lVar47 + -3];
                fVar6 = pfVar37[lVar47 + -2];
                fVar196 = fVar196 + fVar2 * *pfVar36 + fVar203 * pfVar36[0x20];
                fVar197 = fVar197 + fVar2 * pfVar36[1] + fVar203 * pfVar36[0x21];
                fVar198 = fVar198 + fVar2 * pfVar36[2] + fVar203 * pfVar36[0x22];
                fVar199 = fVar199 + fVar2 * pfVar36[3] + fVar203 * pfVar36[0x23];
                fVar200 = fVar200 + fVar2 * pfVar36[4] + fVar203 * pfVar36[0x24];
                fVar201 = fVar201 + fVar2 * pfVar36[5] + fVar203 * pfVar36[0x25];
                fVar202 = fVar202 + fVar2 * pfVar36[6] + fVar203 * pfVar36[0x26];
                fVar203 = fVar116 + fVar203;
                fVar186 = fVar186 + fVar3 * pfVar36[8] + fVar6 * pfVar36[0x28];
                fVar189 = fVar189 + fVar3 * pfVar36[9] + fVar6 * pfVar36[0x29];
                fVar190 = fVar190 + fVar3 * pfVar36[10] + fVar6 * pfVar36[0x2a];
                fVar191 = fVar191 + fVar3 * pfVar36[0xb] + fVar6 * pfVar36[0x2b];
                fVar192 = fVar192 + fVar3 * pfVar36[0xc] + fVar6 * pfVar36[0x2c];
                fVar193 = fVar193 + fVar3 * pfVar36[0xd] + fVar6 * pfVar36[0x2d];
                fVar194 = fVar194 + fVar3 * pfVar36[0xe] + fVar6 * pfVar36[0x2e];
                fVar195 = fVar195 + fVar3 + fVar116;
                fVar2 = pfVar37[lVar47 + -1];
                fVar3 = pfVar37[lVar47];
                in_ZMM3 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3 * pfVar36[0x3e],
                                                             CONCAT420(fVar3 * pfVar36[0x3d],
                                                                       CONCAT416(fVar3 * pfVar36[
                                                  0x3c],CONCAT412(fVar3 * pfVar36[0x3b],
                                                                  CONCAT48(fVar3 * pfVar36[0x3a],
                                                                           CONCAT44(fVar3 * pfVar36[
                                                  0x39],fVar3 * pfVar36[0x38]))))))));
                fVar77 = fVar4 * pfVar36[0x10] + fVar77 + fVar2 * pfVar36[0x30];
                fVar93 = fVar4 * pfVar36[0x11] + fVar93 + fVar2 * pfVar36[0x31];
                fVar94 = fVar4 * pfVar36[0x12] + fVar94 + fVar2 * pfVar36[0x32];
                fVar95 = fVar4 * pfVar36[0x13] + fVar95 + fVar2 * pfVar36[0x33];
                fVar96 = fVar4 * pfVar36[0x14] + fVar96 + fVar2 * pfVar36[0x34];
                fVar97 = fVar4 * pfVar36[0x15] + fVar97 + fVar2 * pfVar36[0x35];
                fVar98 = fVar4 * pfVar36[0x16] + fVar98 + fVar2 * pfVar36[0x36];
                fVar99 = fVar4 + fVar99 + fVar2;
                fVar143 = fVar143 + fVar3 * pfVar36[0x38];
                fVar147 = fVar147 + fVar3 * pfVar36[0x39];
                fVar148 = fVar148 + fVar3 * pfVar36[0x3a];
                fVar149 = fVar149 + fVar3 * pfVar36[0x3b];
                fVar150 = fVar150 + fVar3 * pfVar36[0x3c];
                fVar151 = fVar151 + fVar3 * pfVar36[0x3d];
                fVar152 = fVar152 + fVar3 * pfVar36[0x3e];
                fVar153 = fVar5 + fVar153 + fVar3;
                pfVar36 = pfVar36 + 0x40;
                pfVar37 = pfVar37 + lVar41;
              }
              pfVar51 = pfVar51 + uVar69 * 0x40;
              pfVar32 = pfVar32 + lVar41 * uVar69;
            }
            uVar62 = uVar69;
            pfVar36 = pfVar51;
            if (local_88.elempack == 1) {
              while ((int)uVar62 != 0) {
                fVar2 = *pfVar32;
                fVar3 = pfVar32[lVar47];
                fVar116 = fVar203 + fVar2;
                fVar4 = pfVar32[iVar22];
                fVar5 = pfVar32[iVar8];
                fVar143 = fVar5 * pfVar36[0x18] + fVar143;
                fVar147 = fVar5 * pfVar36[0x19] + fVar147;
                fVar148 = fVar5 * pfVar36[0x1a] + fVar148;
                fVar149 = fVar5 * pfVar36[0x1b] + fVar149;
                fVar150 = fVar5 * pfVar36[0x1c] + fVar150;
                fVar151 = fVar5 * pfVar36[0x1d] + fVar151;
                fVar152 = fVar5 * pfVar36[0x1e] + fVar152;
                in_ZMM4 = ZEXT3264(CONCAT428(fVar5 + fVar153,
                                             CONCAT424(fVar152,CONCAT420(fVar151,CONCAT416(fVar150,
                                                  CONCAT412(fVar149,CONCAT48(fVar148,CONCAT44(
                                                  fVar147,fVar143))))))));
                fVar203 = pfVar32[iVar26];
                fVar6 = pfVar32[iVar18];
                fVar196 = fVar196 + fVar2 * *pfVar36 + fVar203 * pfVar36[0x20];
                fVar197 = fVar197 + fVar2 * pfVar36[1] + fVar203 * pfVar36[0x21];
                fVar198 = fVar198 + fVar2 * pfVar36[2] + fVar203 * pfVar36[0x22];
                fVar199 = fVar199 + fVar2 * pfVar36[3] + fVar203 * pfVar36[0x23];
                fVar200 = fVar200 + fVar2 * pfVar36[4] + fVar203 * pfVar36[0x24];
                fVar201 = fVar201 + fVar2 * pfVar36[5] + fVar203 * pfVar36[0x25];
                fVar202 = fVar202 + fVar2 * pfVar36[6] + fVar203 * pfVar36[0x26];
                fVar203 = fVar116 + fVar203;
                fVar186 = fVar186 + fVar3 * pfVar36[8] + fVar6 * pfVar36[0x28];
                fVar189 = fVar189 + fVar3 * pfVar36[9] + fVar6 * pfVar36[0x29];
                fVar190 = fVar190 + fVar3 * pfVar36[10] + fVar6 * pfVar36[0x2a];
                fVar191 = fVar191 + fVar3 * pfVar36[0xb] + fVar6 * pfVar36[0x2b];
                fVar192 = fVar192 + fVar3 * pfVar36[0xc] + fVar6 * pfVar36[0x2c];
                fVar193 = fVar193 + fVar3 * pfVar36[0xd] + fVar6 * pfVar36[0x2d];
                fVar194 = fVar194 + fVar3 * pfVar36[0xe] + fVar6 * pfVar36[0x2e];
                fVar195 = fVar195 + fVar3 + fVar116;
                fVar2 = pfVar32[iVar27];
                fVar3 = pfVar32[iVar38];
                in_ZMM3 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3 * pfVar36[0x3e],
                                                             CONCAT420(fVar3 * pfVar36[0x3d],
                                                                       CONCAT416(fVar3 * pfVar36[
                                                  0x3c],CONCAT412(fVar3 * pfVar36[0x3b],
                                                                  CONCAT48(fVar3 * pfVar36[0x3a],
                                                                           CONCAT44(fVar3 * pfVar36[
                                                  0x39],fVar3 * pfVar36[0x38]))))))));
                fVar77 = fVar4 * pfVar36[0x10] + fVar77 + fVar2 * pfVar36[0x30];
                fVar93 = fVar4 * pfVar36[0x11] + fVar93 + fVar2 * pfVar36[0x31];
                fVar94 = fVar4 * pfVar36[0x12] + fVar94 + fVar2 * pfVar36[0x32];
                fVar95 = fVar4 * pfVar36[0x13] + fVar95 + fVar2 * pfVar36[0x33];
                fVar96 = fVar4 * pfVar36[0x14] + fVar96 + fVar2 * pfVar36[0x34];
                fVar97 = fVar4 * pfVar36[0x15] + fVar97 + fVar2 * pfVar36[0x35];
                fVar98 = fVar4 * pfVar36[0x16] + fVar98 + fVar2 * pfVar36[0x36];
                fVar99 = fVar4 + fVar99 + fVar2;
                fVar143 = fVar143 + fVar3 * pfVar36[0x38];
                fVar147 = fVar147 + fVar3 * pfVar36[0x39];
                fVar148 = fVar148 + fVar3 * pfVar36[0x3a];
                fVar149 = fVar149 + fVar3 * pfVar36[0x3b];
                fVar150 = fVar150 + fVar3 * pfVar36[0x3c];
                fVar151 = fVar151 + fVar3 * pfVar36[0x3d];
                fVar152 = fVar152 + fVar3 * pfVar36[0x3e];
                fVar153 = fVar5 + fVar153 + fVar3;
                pfVar32 = pfVar32 + lVar70;
                uVar62 = (ulong)((int)uVar62 - 1);
                pfVar36 = pfVar36 + 0x40;
              }
              pfVar51 = pfVar51 + uVar69 * 0x40;
            }
            uVar54 = uVar54 + 8;
            lVar61 = lVar61 + lVar42 * 8;
            pfVar65 = pfVar65 + lVar42 * 2;
          }
          for (; (int)((uint)uVar54 | 3) < local_210; uVar54 = uVar54 + 4) {
            lVar31 = (int)((long)((ulong)(uint)((int)(uint)uVar54 >> 0x1f) << 0x20 |
                                 uVar54 & 0xffffffff) / (long)local_88.elempack) * lVar42;
            if (local_88.elempack == 4) {
              pfVar32 = (float *)((long)local_88.data + lVar31 + (long)iVar48 * 4);
              uVar62 = uVar69;
              pfVar36 = pfVar51;
              while (iVar52 = (int)uVar62, uVar62 = (ulong)(iVar52 - 1), iVar52 != 0) {
                fVar2 = *pfVar32;
                fVar3 = pfVar32[1];
                fVar196 = fVar196 + fVar2 * *pfVar36;
                fVar197 = fVar197 + fVar2 * pfVar36[1];
                fVar198 = fVar198 + fVar2 * pfVar36[2];
                fVar199 = fVar199 + fVar2 * pfVar36[3];
                fVar200 = fVar200 + fVar2 * pfVar36[4];
                fVar201 = fVar201 + fVar2 * pfVar36[5];
                fVar202 = fVar202 + fVar2 * pfVar36[6];
                fVar203 = fVar203 + fVar2;
                fVar186 = fVar186 + fVar3 * pfVar36[8];
                fVar189 = fVar189 + fVar3 * pfVar36[9];
                fVar190 = fVar190 + fVar3 * pfVar36[10];
                fVar191 = fVar191 + fVar3 * pfVar36[0xb];
                fVar192 = fVar192 + fVar3 * pfVar36[0xc];
                fVar193 = fVar193 + fVar3 * pfVar36[0xd];
                fVar194 = fVar194 + fVar3 * pfVar36[0xe];
                fVar195 = fVar195 + fVar2;
                fVar2 = pfVar32[2];
                fVar3 = pfVar32[3];
                in_ZMM3 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3 * pfVar36[0x1e],
                                                             CONCAT420(fVar3 * pfVar36[0x1d],
                                                                       CONCAT416(fVar3 * pfVar36[
                                                  0x1c],CONCAT412(fVar3 * pfVar36[0x1b],
                                                                  CONCAT48(fVar3 * pfVar36[0x1a],
                                                                           CONCAT44(fVar3 * pfVar36[
                                                  0x19],fVar3 * pfVar36[0x18]))))))));
                fVar77 = fVar2 * pfVar36[0x10] + fVar77;
                fVar93 = fVar2 * pfVar36[0x11] + fVar93;
                fVar94 = fVar2 * pfVar36[0x12] + fVar94;
                fVar95 = fVar2 * pfVar36[0x13] + fVar95;
                fVar96 = fVar2 * pfVar36[0x14] + fVar96;
                fVar97 = fVar2 * pfVar36[0x15] + fVar97;
                fVar98 = fVar2 * pfVar36[0x16] + fVar98;
                fVar99 = fVar2 + fVar99;
                fVar143 = fVar3 * pfVar36[0x18] + fVar143;
                fVar147 = fVar3 * pfVar36[0x19] + fVar147;
                fVar148 = fVar3 * pfVar36[0x1a] + fVar148;
                fVar149 = fVar3 * pfVar36[0x1b] + fVar149;
                fVar150 = fVar3 * pfVar36[0x1c] + fVar150;
                fVar151 = fVar3 * pfVar36[0x1d] + fVar151;
                fVar152 = fVar3 * pfVar36[0x1e] + fVar152;
                fVar153 = fVar3 + fVar153;
                pfVar36 = pfVar36 + 0x20;
                pfVar32 = pfVar32 + lVar41;
              }
              pfVar51 = pfVar51 + uVar69 * 0x20;
            }
            else {
              pfVar32 = (float *)((long)local_88.data + lVar31 + (long)iVar28 * 4);
            }
            uVar62 = uVar69;
            pfVar36 = pfVar51;
            if (local_88.elempack == 1) {
              while ((int)uVar62 != 0) {
                fVar2 = *pfVar32;
                fVar3 = pfVar32[lVar47];
                fVar196 = fVar196 + fVar2 * *pfVar36;
                fVar197 = fVar197 + fVar2 * pfVar36[1];
                fVar198 = fVar198 + fVar2 * pfVar36[2];
                fVar199 = fVar199 + fVar2 * pfVar36[3];
                fVar200 = fVar200 + fVar2 * pfVar36[4];
                fVar201 = fVar201 + fVar2 * pfVar36[5];
                fVar202 = fVar202 + fVar2 * pfVar36[6];
                fVar203 = fVar203 + fVar2;
                fVar186 = fVar186 + fVar3 * pfVar36[8];
                fVar189 = fVar189 + fVar3 * pfVar36[9];
                fVar190 = fVar190 + fVar3 * pfVar36[10];
                fVar191 = fVar191 + fVar3 * pfVar36[0xb];
                fVar192 = fVar192 + fVar3 * pfVar36[0xc];
                fVar193 = fVar193 + fVar3 * pfVar36[0xd];
                fVar194 = fVar194 + fVar3 * pfVar36[0xe];
                fVar195 = fVar195 + fVar2;
                fVar2 = pfVar32[iVar22];
                fVar3 = pfVar32[iVar8];
                in_ZMM3 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3 * pfVar36[0x1e],
                                                             CONCAT420(fVar3 * pfVar36[0x1d],
                                                                       CONCAT416(fVar3 * pfVar36[
                                                  0x1c],CONCAT412(fVar3 * pfVar36[0x1b],
                                                                  CONCAT48(fVar3 * pfVar36[0x1a],
                                                                           CONCAT44(fVar3 * pfVar36[
                                                  0x19],fVar3 * pfVar36[0x18]))))))));
                fVar77 = fVar2 * pfVar36[0x10] + fVar77;
                fVar93 = fVar2 * pfVar36[0x11] + fVar93;
                fVar94 = fVar2 * pfVar36[0x12] + fVar94;
                fVar95 = fVar2 * pfVar36[0x13] + fVar95;
                fVar96 = fVar2 * pfVar36[0x14] + fVar96;
                fVar97 = fVar2 * pfVar36[0x15] + fVar97;
                fVar98 = fVar2 * pfVar36[0x16] + fVar98;
                fVar99 = fVar2 + fVar99;
                fVar143 = fVar3 * pfVar36[0x18] + fVar143;
                fVar147 = fVar3 * pfVar36[0x19] + fVar147;
                fVar148 = fVar3 * pfVar36[0x1a] + fVar148;
                fVar149 = fVar3 * pfVar36[0x1b] + fVar149;
                fVar150 = fVar3 * pfVar36[0x1c] + fVar150;
                fVar151 = fVar3 * pfVar36[0x1d] + fVar151;
                fVar152 = fVar3 * pfVar36[0x1e] + fVar152;
                fVar153 = fVar3 + fVar153;
                pfVar32 = pfVar32 + lVar70;
                uVar62 = (ulong)((int)uVar62 - 1);
                pfVar36 = pfVar36 + 0x20;
              }
              pfVar51 = pfVar51 + uVar69 * 0x20;
            }
            lVar61 = lVar61 + lVar42 * 4;
            pfVar65 = pfVar65 + lVar42;
          }
          for (; (long)(uVar54 | 1) < lVar59; uVar54 = uVar54 + 2) {
            lVar31 = 0;
            uVar62 = uVar69;
            pfVar32 = pfVar51;
            while (iVar28 = (int)uVar62, uVar62 = (ulong)(iVar28 - 1), iVar28 != 0) {
              fVar2 = *(float *)((long)pfVar65 + lVar31);
              fVar3 = *(float *)(lVar61 + lVar31);
              in_ZMM3 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3 * pfVar32[0xe],
                                                           CONCAT420(fVar3 * pfVar32[0xd],
                                                                     CONCAT416(fVar3 * pfVar32[0xc],
                                                                               CONCAT412(fVar3 * 
                                                  pfVar32[0xb],
                                                  CONCAT48(fVar3 * pfVar32[10],
                                                           CONCAT44(fVar3 * pfVar32[9],
                                                                    fVar3 * pfVar32[8]))))))));
              fVar196 = fVar196 + fVar2 * *pfVar32;
              fVar197 = fVar197 + fVar2 * pfVar32[1];
              fVar198 = fVar198 + fVar2 * pfVar32[2];
              fVar199 = fVar199 + fVar2 * pfVar32[3];
              fVar200 = fVar200 + fVar2 * pfVar32[4];
              fVar201 = fVar201 + fVar2 * pfVar32[5];
              fVar202 = fVar202 + fVar2 * pfVar32[6];
              fVar203 = fVar203 + fVar2;
              fVar186 = fVar186 + fVar3 * pfVar32[8];
              fVar189 = fVar189 + fVar3 * pfVar32[9];
              fVar190 = fVar190 + fVar3 * pfVar32[10];
              fVar191 = fVar191 + fVar3 * pfVar32[0xb];
              fVar192 = fVar192 + fVar3 * pfVar32[0xc];
              fVar193 = fVar193 + fVar3 * pfVar32[0xd];
              fVar194 = fVar194 + fVar3 * pfVar32[0xe];
              fVar195 = fVar195 + fVar3;
              pfVar32 = pfVar32 + 0x10;
              lVar31 = lVar31 + lVar71;
            }
            pfVar51 = pfVar51 + uVar69 * 0x10;
            lVar61 = lVar61 + lVar42 * 2;
            pfVar65 = (float *)((long)pfVar65 + lVar42 * 2);
          }
          for (; uVar62 = uVar69, pfVar32 = pfVar65, pfVar36 = pfVar51, (long)uVar54 < lVar59;
              uVar54 = uVar54 + 1) {
            while ((int)uVar62 != 0) {
              fVar2 = *pfVar32;
              fVar196 = fVar196 + fVar2 * *pfVar36;
              fVar197 = fVar197 + fVar2 * pfVar36[1];
              fVar198 = fVar198 + fVar2 * pfVar36[2];
              fVar199 = fVar199 + fVar2 * pfVar36[3];
              fVar200 = fVar200 + fVar2 * pfVar36[4];
              fVar201 = fVar201 + fVar2 * pfVar36[5];
              fVar202 = fVar202 + fVar2 * pfVar36[6];
              fVar203 = fVar203 + fVar2;
              uVar62 = (ulong)((int)uVar62 - 1);
              pfVar32 = pfVar32 + lVar70;
              pfVar36 = pfVar36 + 8;
            }
            pfVar51 = pfVar51 + uVar69 * 8;
            pfVar65 = (float *)((long)pfVar65 + lVar42);
          }
          fVar196 = fVar77 + fVar143 + fVar186 + fVar196;
          fVar197 = fVar93 + fVar147 + fVar189 + fVar197;
          auVar90._0_8_ = CONCAT44(fVar197,fVar196);
          auVar90._8_4_ = fVar94 + fVar148 + fVar190 + fVar198;
          auVar90._12_4_ = fVar95 + fVar149 + fVar191 + fVar199;
          auVar90._16_4_ = fVar96 + fVar150 + fVar192 + fVar200;
          auVar90._20_4_ = fVar97 + fVar151 + fVar193 + fVar201;
          auVar90._24_4_ = fVar98 + fVar152 + fVar194 + fVar202;
          auVar90._28_4_ = fVar99 + fVar153 + fVar195 + fVar203;
          auVar146 = auVar90;
          if (5 < iVar10 - 1U) goto switchD_004e1540_caseD_1;
          auVar75 = auVar76._0_32_;
          auVar146 = vmaxps_avx(auVar90,auVar75);
          fVar203 = auVar180._0_4_;
          fVar148 = auVar180._4_4_;
          fVar149 = auVar180._8_4_;
          fVar198 = auVar180._12_4_;
          fVar199 = auVar180._16_4_;
          fVar200 = auVar180._20_4_;
          fVar201 = auVar180._24_4_;
          fVar202 = auVar180._28_4_;
          switch(iVar10) {
          case 2:
            auVar90 = vminps_avx(auVar90,auVar75);
            fVar203 = *(this->super_Convolution1D).activation_params.data;
            auVar144._0_4_ = fVar203 * auVar90._0_4_ + auVar146._0_4_;
            auVar144._4_4_ = fVar203 * auVar90._4_4_ + auVar146._4_4_;
            auVar144._8_4_ = fVar203 * auVar90._8_4_ + auVar146._8_4_;
            auVar144._12_4_ = fVar203 * auVar90._12_4_ + auVar146._12_4_;
            auVar144._16_4_ = fVar203 * auVar90._16_4_ + auVar146._16_4_;
            auVar144._20_4_ = fVar203 * auVar90._20_4_ + auVar146._20_4_;
            auVar144._24_4_ = fVar203 * auVar90._24_4_ + auVar146._24_4_;
            auVar144._28_4_ = auVar90._28_4_ + auVar146._28_4_;
            auVar146 = auVar144;
            break;
          case 3:
            puVar63 = (undefined4 *)(this->super_Convolution1D).activation_params.data;
            uVar11 = *puVar63;
            auVar110._4_4_ = uVar11;
            auVar110._0_4_ = uVar11;
            auVar110._8_4_ = uVar11;
            auVar110._12_4_ = uVar11;
            auVar110._16_4_ = uVar11;
            auVar110._20_4_ = uVar11;
            auVar110._24_4_ = uVar11;
            auVar110._28_4_ = uVar11;
            uVar11 = puVar63[1];
            auVar131._4_4_ = uVar11;
            auVar131._0_4_ = uVar11;
            auVar131._8_4_ = uVar11;
            auVar131._12_4_ = uVar11;
            auVar131._16_4_ = uVar11;
            auVar131._20_4_ = uVar11;
            auVar131._24_4_ = uVar11;
            auVar131._28_4_ = uVar11;
            in_ZMM3 = ZEXT3264(auVar131);
            auVar146 = vmaxps_avx(auVar90,auVar110);
            auVar146 = vminps_avx(auVar146,auVar131);
            break;
          case 4:
            auVar91._0_8_ = auVar90._0_8_ ^ 0x8000000080000000;
            auVar91._8_4_ = -auVar90._8_4_;
            auVar91._12_4_ = -auVar90._12_4_;
            auVar91._16_4_ = -auVar90._16_4_;
            auVar91._20_4_ = -auVar90._20_4_;
            auVar91._24_4_ = -auVar90._24_4_;
            auVar91._28_4_ = -auVar90._28_4_;
            auVar111._8_4_ = 0x42b0c0a5;
            auVar111._0_8_ = 0x42b0c0a542b0c0a5;
            auVar111._12_4_ = 0x42b0c0a5;
            auVar111._16_4_ = 0x42b0c0a5;
            auVar111._20_4_ = 0x42b0c0a5;
            auVar111._24_4_ = 0x42b0c0a5;
            auVar111._28_4_ = 0x42b0c0a5;
            auVar146 = vminps_avx(auVar91,auVar111);
            auVar112._8_4_ = 0xc2b0c0a5;
            auVar112._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar112._12_4_ = 0xc2b0c0a5;
            auVar112._16_4_ = 0xc2b0c0a5;
            auVar112._20_4_ = 0xc2b0c0a5;
            auVar112._24_4_ = 0xc2b0c0a5;
            auVar112._28_4_ = 0xc2b0c0a5;
            auVar90 = vmaxps_avx(auVar146,auVar112);
            auVar113._0_4_ = fVar203 + auVar90._0_4_ * 1.442695;
            auVar113._4_4_ = fVar148 + auVar90._4_4_ * 1.442695;
            auVar113._8_4_ = fVar149 + auVar90._8_4_ * 1.442695;
            auVar113._12_4_ = fVar198 + auVar90._12_4_ * 1.442695;
            auVar113._16_4_ = fVar199 + auVar90._16_4_ * 1.442695;
            auVar113._20_4_ = fVar200 + auVar90._20_4_ * 1.442695;
            auVar113._24_4_ = fVar201 + auVar90._24_4_ * 1.442695;
            auVar113._28_4_ = fVar202 + 1.442695;
            auVar75 = vroundps_avx(auVar113,1);
            auVar146 = vcmpps_avx(auVar113,auVar75,1);
            auVar146 = vandps_avx(auVar146,auVar142);
            auVar146 = vsubps_avx(auVar75,auVar146);
            fVar196 = auVar90._0_4_ + auVar146._0_4_ * -0.6931472;
            fVar197 = auVar90._4_4_ + auVar146._4_4_ * -0.6931472;
            fVar202 = auVar90._8_4_ + auVar146._8_4_ * -0.6931472;
            fVar143 = auVar90._12_4_ + auVar146._12_4_ * -0.6931472;
            fVar147 = auVar90._16_4_ + auVar146._16_4_ * -0.6931472;
            fVar150 = auVar90._20_4_ + auVar146._20_4_ * -0.6931472;
            fVar151 = auVar90._24_4_ + auVar146._24_4_ * -0.6931472;
            auVar100._0_4_ = (int)auVar146._0_4_;
            auVar100._4_4_ = (int)auVar146._4_4_;
            auVar100._8_4_ = (int)auVar146._8_4_;
            auVar100._12_4_ = (int)auVar146._12_4_;
            auVar114._16_4_ = (int)auVar146._16_4_;
            auVar114._0_16_ = auVar100;
            auVar114._20_4_ = (int)auVar146._20_4_;
            auVar114._24_4_ = (int)auVar146._24_4_;
            auVar114._28_4_ = (int)auVar146._28_4_;
            auVar132 = vpslld_avx(auVar100,0x17);
            auVar117 = vpslld_avx(auVar114._16_16_,0x17);
            auVar134._8_4_ = 0x3f800000;
            auVar134._0_8_ = 0x3f8000003f800000;
            auVar134._12_4_ = 0x3f800000;
            in_ZMM4 = ZEXT1664(auVar134);
            auVar117 = vpaddd_avx(auVar117,auVar134);
            auVar132 = vpaddd_avx(auVar132,auVar134);
            in_ZMM3 = ZEXT1664(auVar132);
            auVar92._0_4_ =
                 (fVar196 + 1.0 +
                 fVar196 * fVar196 *
                 (fVar203 +
                 ((((fVar196 * 0.00019875691 + 0.0013981999) * fVar196 + 0.008333452) * fVar196 +
                  0.041665796) * fVar196 + 0.16666666) * fVar196)) * auVar132._0_4_ + 1.0;
            auVar92._4_4_ =
                 (fVar197 + 1.0 +
                 fVar197 * fVar197 *
                 (fVar148 +
                 ((((fVar197 * 0.00019875691 + 0.0013981999) * fVar197 + 0.008333452) * fVar197 +
                  0.041665796) * fVar197 + 0.16666666) * fVar197)) * auVar132._4_4_ + 1.0;
            auVar92._8_4_ =
                 (fVar202 + 1.0 +
                 fVar202 * fVar202 *
                 (fVar149 +
                 ((((fVar202 * 0.00019875691 + 0.0013981999) * fVar202 + 0.008333452) * fVar202 +
                  0.041665796) * fVar202 + 0.16666666) * fVar202)) * auVar132._8_4_ + 1.0;
            auVar92._12_4_ =
                 (fVar143 + 1.0 +
                 fVar143 * fVar143 *
                 (fVar198 +
                 ((((fVar143 * 0.00019875691 + 0.0013981999) * fVar143 + 0.008333452) * fVar143 +
                  0.041665796) * fVar143 + 0.16666666) * fVar143)) * auVar132._12_4_ + 1.0;
            auVar92._16_4_ =
                 (fVar147 + 1.0 +
                 fVar147 * fVar147 *
                 (fVar199 +
                 ((((fVar147 * 0.00019875691 + 0.0013981999) * fVar147 + 0.008333452) * fVar147 +
                  0.041665796) * fVar147 + 0.16666666) * fVar147)) * auVar117._0_4_ + 1.0;
            auVar92._20_4_ =
                 (fVar150 + 1.0 +
                 fVar150 * fVar150 *
                 (fVar200 +
                 ((((fVar150 * 0.00019875691 + 0.0013981999) * fVar150 + 0.008333452) * fVar150 +
                  0.041665796) * fVar150 + 0.16666666) * fVar150)) * auVar117._4_4_ + 1.0;
            auVar92._24_4_ =
                 (fVar151 + 1.0 +
                 fVar151 * fVar151 *
                 (fVar201 +
                 ((((fVar151 * 0.00019875691 + 0.0013981999) * fVar151 + 0.008333452) * fVar151 +
                  0.041665796) * fVar151 + 0.16666666) * fVar151)) * auVar117._8_4_ + 1.0;
            auVar92._28_4_ = auVar90._28_4_ + -0.6931472 + 1.0 + -0.6931472 + 1.0;
            auVar146 = vdivps_avx(auVar142,auVar92);
            break;
          case 5:
            auVar154._8_4_ = 0x42b0c0a5;
            auVar154._0_8_ = 0x42b0c0a542b0c0a5;
            auVar154._12_4_ = 0x42b0c0a5;
            auVar154._16_4_ = 0x42b0c0a5;
            auVar154._20_4_ = 0x42b0c0a5;
            auVar154._24_4_ = 0x42b0c0a5;
            auVar154._28_4_ = 0x42b0c0a5;
            auVar146 = vminps_avx(auVar154,auVar90);
            auVar164._8_4_ = 0xc2b0c0a5;
            auVar164._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar164._12_4_ = 0xc2b0c0a5;
            auVar164._16_4_ = 0xc2b0c0a5;
            auVar164._20_4_ = 0xc2b0c0a5;
            auVar164._24_4_ = 0xc2b0c0a5;
            auVar164._28_4_ = 0xc2b0c0a5;
            auVar75 = vmaxps_avx(auVar164,auVar146);
            auVar123._0_4_ = fVar203 + auVar75._0_4_ * 1.442695;
            auVar123._4_4_ = fVar148 + auVar75._4_4_ * 1.442695;
            auVar123._8_4_ = fVar149 + auVar75._8_4_ * 1.442695;
            auVar123._12_4_ = fVar198 + auVar75._12_4_ * 1.442695;
            auVar123._16_4_ = fVar199 + auVar75._16_4_ * 1.442695;
            auVar123._20_4_ = fVar200 + auVar75._20_4_ * 1.442695;
            auVar123._24_4_ = fVar201 + auVar75._24_4_ * 1.442695;
            auVar123._28_4_ = fVar202 + in_ZMM3._28_4_;
            auVar115 = vroundps_avx(auVar123,1);
            auVar146 = vcmpps_avx(auVar123,auVar115,1);
            auVar146 = vandps_avx(auVar146,auVar142);
            auVar146 = vsubps_avx(auVar115,auVar146);
            auVar19._4_4_ = auVar146._4_4_ * 0.6931472;
            auVar19._0_4_ = auVar146._0_4_ * 0.6931472;
            auVar19._8_4_ = auVar146._8_4_ * 0.6931472;
            auVar19._12_4_ = auVar146._12_4_ * 0.6931472;
            auVar19._16_4_ = auVar146._16_4_ * 0.6931472;
            auVar19._20_4_ = auVar146._20_4_ * 0.6931472;
            auVar19._24_4_ = auVar146._24_4_ * 0.6931472;
            auVar19._28_4_ = auVar115._28_4_;
            auVar75 = vsubps_avx(auVar75,auVar19);
            fVar143 = auVar75._0_4_;
            fVar147 = auVar75._4_4_;
            fVar150 = auVar75._8_4_;
            fVar151 = auVar75._12_4_;
            fVar152 = auVar75._16_4_;
            fVar153 = auVar75._20_4_;
            fVar94 = auVar75._24_4_;
            auVar117._0_4_ = (int)auVar146._0_4_;
            auVar117._4_4_ = (int)auVar146._4_4_;
            auVar117._8_4_ = (int)auVar146._8_4_;
            auVar117._12_4_ = (int)auVar146._12_4_;
            auVar124._16_4_ = (int)auVar146._16_4_;
            auVar124._0_16_ = auVar117;
            auVar124._20_4_ = (int)auVar146._20_4_;
            auVar124._24_4_ = (int)auVar146._24_4_;
            auVar124._28_4_ = (int)auVar146._28_4_;
            auVar132 = vpslld_avx(auVar117,0x17);
            auVar117 = vpslld_avx(auVar124._16_16_,0x17);
            auVar117 = vpaddd_avx(auVar167,auVar117);
            auVar132 = vpaddd_avx(auVar167,auVar132);
            auVar145._0_4_ =
                 (fVar143 + 1.0 +
                 fVar143 * fVar143 *
                 (((((fVar143 * 0.00019875691 + 0.0013981999) * fVar143 + 0.008333452) * fVar143 +
                   0.041665796) * fVar143 + 0.16666666) * fVar143 + fVar203)) * auVar132._0_4_ + 1.0
            ;
            auVar145._4_4_ =
                 (fVar147 + 1.0 +
                 fVar147 * fVar147 *
                 (((((fVar147 * 0.00019875691 + 0.0013981999) * fVar147 + 0.008333452) * fVar147 +
                   0.041665796) * fVar147 + 0.16666666) * fVar147 + fVar148)) * auVar132._4_4_ + 1.0
            ;
            auVar145._8_4_ =
                 (fVar150 + 1.0 +
                 fVar150 * fVar150 *
                 (((((fVar150 * 0.00019875691 + 0.0013981999) * fVar150 + 0.008333452) * fVar150 +
                   0.041665796) * fVar150 + 0.16666666) * fVar150 + fVar149)) * auVar132._8_4_ + 1.0
            ;
            auVar145._12_4_ =
                 (fVar151 + 1.0 +
                 fVar151 * fVar151 *
                 (((((fVar151 * 0.00019875691 + 0.0013981999) * fVar151 + 0.008333452) * fVar151 +
                   0.041665796) * fVar151 + 0.16666666) * fVar151 + fVar198)) * auVar132._12_4_ +
                 1.0;
            auVar145._16_4_ =
                 (fVar152 + 1.0 +
                 fVar152 * fVar152 *
                 (((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) * fVar152 +
                   0.041665796) * fVar152 + 0.16666666) * fVar152 + fVar199)) * auVar117._0_4_ + 1.0
            ;
            auVar145._20_4_ =
                 (fVar153 + 1.0 +
                 fVar153 * fVar153 *
                 (((((fVar153 * 0.00019875691 + 0.0013981999) * fVar153 + 0.008333452) * fVar153 +
                   0.041665796) * fVar153 + 0.16666666) * fVar153 + fVar200)) * auVar117._4_4_ + 1.0
            ;
            auVar145._24_4_ =
                 (fVar94 + 1.0 +
                 fVar94 * fVar94 *
                 (((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) * fVar94 +
                   0.041665796) * fVar94 + 0.16666666) * fVar94 + fVar201)) * auVar117._8_4_ + 1.0;
            auVar145._28_4_ = auVar75._28_4_ + 1.0 + auVar115._28_4_ + 1.0;
            auVar75._8_4_ = 0x800000;
            auVar75._0_8_ = 0x80000000800000;
            auVar75._12_4_ = 0x800000;
            auVar75._16_4_ = 0x800000;
            auVar75._20_4_ = 0x800000;
            auVar75._24_4_ = 0x800000;
            auVar75._28_4_ = 0x800000;
            auVar115 = vmaxps_avx(auVar145,auVar75);
            auVar117 = vpsrld_avx(auVar115._16_16_,0x17);
            auVar140._8_4_ = 0x807fffff;
            auVar140._0_8_ = 0x807fffff807fffff;
            auVar140._12_4_ = 0x807fffff;
            auVar140._16_4_ = 0x807fffff;
            auVar140._20_4_ = 0x807fffff;
            auVar140._24_4_ = 0x807fffff;
            auVar140._28_4_ = 0x807fffff;
            auVar146 = vandps_avx(auVar115,auVar140);
            auVar130 = vorps_avx(auVar146,auVar180._0_32_);
            auVar188._8_4_ = 0x3f3504f3;
            auVar188._0_8_ = 0x3f3504f33f3504f3;
            auVar188._12_4_ = 0x3f3504f3;
            auVar188._16_4_ = 0x3f3504f3;
            auVar188._20_4_ = 0x3f3504f3;
            auVar188._24_4_ = 0x3f3504f3;
            auVar188._28_4_ = 0x3f3504f3;
            auVar75 = vcmpps_avx(auVar188,auVar130,2);
            auVar146 = vandnps_avx(auVar75,auVar130);
            fVar143 = auVar146._0_4_ + auVar130._0_4_ + -1.0;
            fVar147 = auVar146._4_4_ + auVar130._4_4_ + -1.0;
            fVar150 = auVar146._8_4_ + auVar130._8_4_ + -1.0;
            fVar151 = auVar146._12_4_ + auVar130._12_4_ + -1.0;
            fVar152 = auVar146._16_4_ + auVar130._16_4_ + -1.0;
            fVar153 = auVar146._20_4_ + auVar130._20_4_ + -1.0;
            fVar94 = auVar146._24_4_ + auVar130._24_4_ + -1.0;
            auVar117 = vpsubd_avx(auVar117,auVar75._16_16_);
            auVar132 = vpsrld_avx(auVar115._0_16_,0x17);
            auVar133._8_4_ = 0xffffff81;
            auVar133._0_8_ = 0xffffff81ffffff81;
            auVar133._12_4_ = 0xffffff81;
            auVar117 = vpaddd_avx(auVar117,auVar133);
            auVar132 = vpsubd_avx(auVar132,auVar75._0_16_);
            auVar132 = vpaddd_avx(auVar132,auVar133);
            auVar108._16_16_ = auVar117;
            auVar108._0_16_ = auVar132;
            auVar75 = vcmpps_avx(auVar145,_DAT_00546e00,2);
            auVar115 = vcvtdq2ps_avx(auVar108);
            auVar20._4_4_ =
                 (fVar147 + auVar115._4_4_ * 0.6931472 +
                 fVar147 * fVar147 *
                 (fVar147 * (fVar147 * (fVar147 * (fVar147 * (fVar147 * (fVar147 * (fVar147 * (
                                                  fVar147 * (fVar147 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                            0.3333333) + -0.5)) * -2.0;
            auVar20._0_4_ =
                 (fVar143 + auVar115._0_4_ * 0.6931472 +
                 fVar143 * fVar143 *
                 (fVar143 * (fVar143 * (fVar143 * (fVar143 * (fVar143 * (fVar143 * (fVar143 * (
                                                  fVar143 * (fVar143 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                            0.3333333) + -0.5)) * -2.0;
            auVar20._8_4_ =
                 (fVar150 + auVar115._8_4_ * 0.6931472 +
                 fVar150 * fVar150 *
                 (fVar150 * (fVar150 * (fVar150 * (fVar150 * (fVar150 * (fVar150 * (fVar150 * (
                                                  fVar150 * (fVar150 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                            0.3333333) + -0.5)) * -2.0;
            auVar20._12_4_ =
                 (fVar151 + auVar115._12_4_ * 0.6931472 +
                 fVar151 * fVar151 *
                 (fVar151 * (fVar151 * (fVar151 * (fVar151 * (fVar151 * (fVar151 * (fVar151 * (
                                                  fVar151 * (fVar151 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                            0.3333333) + -0.5)) * -2.0;
            auVar20._16_4_ =
                 (fVar152 + auVar115._16_4_ * 0.6931472 +
                 fVar152 * fVar152 *
                 (fVar152 * (fVar152 * (fVar152 * (fVar152 * (fVar152 * (fVar152 * (fVar152 * (
                                                  fVar152 * (fVar152 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                            0.3333333) + -0.5)) * -2.0;
            auVar20._20_4_ =
                 (fVar153 + auVar115._20_4_ * 0.6931472 +
                 fVar153 * fVar153 *
                 (fVar153 * (fVar153 * (fVar153 * (fVar153 * (fVar153 * (fVar153 * (fVar153 * (
                                                  fVar153 * (fVar153 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                            0.3333333) + -0.5)) * -2.0;
            auVar20._24_4_ =
                 (fVar94 + auVar115._24_4_ * 0.6931472 +
                 fVar94 * fVar94 *
                 (fVar94 * (fVar94 * (fVar94 * (fVar94 * (fVar94 * (fVar94 * (fVar94 * (fVar94 * (
                                                  fVar94 * 0.070376836 + -0.1151461) + 0.116769984)
                                                  + -0.12420141) + 0.14249323) + -0.16668057) +
                                               0.20000714) + -0.24999994) + 0.3333333) + -0.5)) *
                 -2.0;
            auVar20._28_4_ = auVar146._28_4_ + auVar130._28_4_ + -1.0 + auVar115._28_4_ + 0.0;
            auVar125._8_4_ = 0x7fffffff;
            auVar125._0_8_ = 0x7fffffff7fffffff;
            auVar125._12_4_ = 0x7fffffff;
            auVar125._16_4_ = 0x7fffffff;
            auVar125._20_4_ = 0x7fffffff;
            auVar125._24_4_ = 0x7fffffff;
            auVar125._28_4_ = 0x7fffffff;
            auVar146 = vblendvps_avx(auVar20,auVar125,auVar75);
            auVar126._8_4_ = 0x42b0c0a5;
            auVar126._0_8_ = 0x42b0c0a542b0c0a5;
            auVar126._12_4_ = 0x42b0c0a5;
            auVar126._16_4_ = 0x42b0c0a5;
            auVar126._20_4_ = 0x42b0c0a5;
            auVar126._24_4_ = 0x42b0c0a5;
            auVar126._28_4_ = 0x42b0c0a5;
            auVar146 = vminps_avx(auVar146,auVar126);
            auVar127._8_4_ = 0xc2b0c0a5;
            auVar127._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar127._12_4_ = 0xc2b0c0a5;
            auVar127._16_4_ = 0xc2b0c0a5;
            auVar127._20_4_ = 0xc2b0c0a5;
            auVar127._24_4_ = 0xc2b0c0a5;
            auVar127._28_4_ = 0xc2b0c0a5;
            auVar75 = vmaxps_avx(auVar146,auVar127);
            auVar128._0_4_ = auVar75._0_4_ * 1.442695 + fVar203;
            auVar128._4_4_ = auVar75._4_4_ * 1.442695 + fVar148;
            auVar128._8_4_ = auVar75._8_4_ * 1.442695 + fVar149;
            auVar128._12_4_ = auVar75._12_4_ * 1.442695 + fVar198;
            auVar128._16_4_ = auVar75._16_4_ * 1.442695 + fVar199;
            auVar128._20_4_ = auVar75._20_4_ * 1.442695 + fVar200;
            auVar128._24_4_ = auVar75._24_4_ * 1.442695 + fVar201;
            auVar128._28_4_ = fVar202 + 1.442695;
            auVar115 = vroundps_avx(auVar128,1);
            auVar146 = vcmpps_avx(auVar128,auVar115,1);
            auVar146 = vandps_avx(auVar146,auVar142);
            auVar130 = vsubps_avx(auVar115,auVar146);
            auVar21._4_4_ = auVar130._4_4_ * 0.6931472;
            auVar21._0_4_ = auVar130._0_4_ * 0.6931472;
            auVar21._8_4_ = auVar130._8_4_ * 0.6931472;
            auVar21._12_4_ = auVar130._12_4_ * 0.6931472;
            auVar21._16_4_ = auVar130._16_4_ * 0.6931472;
            auVar21._20_4_ = auVar130._20_4_ * 0.6931472;
            auVar21._24_4_ = auVar130._24_4_ * 0.6931472;
            auVar21._28_4_ = auVar115._28_4_;
            auVar75 = vsubps_avx(auVar75,auVar21);
            fVar143 = auVar75._0_4_;
            fVar147 = auVar75._4_4_;
            fVar150 = auVar75._8_4_;
            fVar151 = auVar75._12_4_;
            fVar152 = auVar75._16_4_;
            fVar153 = auVar75._20_4_;
            fVar94 = auVar75._24_4_;
            auVar180 = ZEXT3264(auVar180._0_32_);
            auVar76 = ZEXT864(0) << 0x20;
            auVar146._0_4_ =
                 fVar203 + ((((fVar143 * 0.00019875691 + 0.0013981999) * fVar143 + 0.008333452) *
                             fVar143 + 0.041665796) * fVar143 + 0.16666666) * fVar143;
            auVar146._4_4_ =
                 fVar148 + ((((fVar147 * 0.00019875691 + 0.0013981999) * fVar147 + 0.008333452) *
                             fVar147 + 0.041665796) * fVar147 + 0.16666666) * fVar147;
            auVar146._8_4_ =
                 fVar149 + ((((fVar150 * 0.00019875691 + 0.0013981999) * fVar150 + 0.008333452) *
                             fVar150 + 0.041665796) * fVar150 + 0.16666666) * fVar150;
            auVar146._12_4_ =
                 fVar198 + ((((fVar151 * 0.00019875691 + 0.0013981999) * fVar151 + 0.008333452) *
                             fVar151 + 0.041665796) * fVar151 + 0.16666666) * fVar151;
            auVar146._16_4_ =
                 fVar199 + ((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) *
                             fVar152 + 0.041665796) * fVar152 + 0.16666666) * fVar152;
            auVar146._20_4_ =
                 fVar200 + ((((fVar153 * 0.00019875691 + 0.0013981999) * fVar153 + 0.008333452) *
                             fVar153 + 0.041665796) * fVar153 + 0.16666666) * fVar153;
            auVar146._24_4_ =
                 fVar201 + ((((fVar94 * 0.00019875691 + 0.0013981999) * fVar94 + 0.008333452) *
                             fVar94 + 0.041665796) * fVar94 + 0.16666666) * fVar94;
            auVar146._28_4_ =
                 fVar202 + auVar145._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666;
            auVar132._0_4_ = (int)auVar130._0_4_;
            auVar132._4_4_ = (int)auVar130._4_4_;
            auVar132._8_4_ = (int)auVar130._8_4_;
            auVar132._12_4_ = (int)auVar130._12_4_;
            auVar129._16_4_ = (int)auVar130._16_4_;
            auVar129._0_16_ = auVar132;
            auVar129._20_4_ = (int)auVar130._20_4_;
            auVar129._24_4_ = (int)auVar130._24_4_;
            auVar129._28_4_ = (int)auVar130._28_4_;
            auVar132 = vpslld_avx(auVar132,0x17);
            auVar117 = vpslld_avx(auVar129._16_16_,0x17);
            auVar117 = vpaddd_avx(auVar167,auVar117);
            auVar132 = vpaddd_avx(auVar167,auVar132);
            in_ZMM4 = ZEXT1664(auVar132);
            auVar109._0_4_ =
                 (fVar143 + 1.0 + fVar143 * fVar143 * auVar146._0_4_) * auVar132._0_4_ + 1.0;
            auVar109._4_4_ =
                 (fVar147 + 1.0 + fVar147 * fVar147 * auVar146._4_4_) * auVar132._4_4_ + 1.0;
            auVar109._8_4_ =
                 (fVar150 + 1.0 + fVar150 * fVar150 * auVar146._8_4_) * auVar132._8_4_ + 1.0;
            auVar109._12_4_ =
                 (fVar151 + 1.0 + fVar151 * fVar151 * auVar146._12_4_) * auVar132._12_4_ + 1.0;
            auVar109._16_4_ =
                 (fVar152 + 1.0 + fVar152 * fVar152 * auVar146._16_4_) * auVar117._0_4_ + 1.0;
            auVar109._20_4_ =
                 (fVar153 + 1.0 + fVar153 * fVar153 * auVar146._20_4_) * auVar117._4_4_ + 1.0;
            auVar109._24_4_ =
                 (fVar94 + 1.0 + fVar94 * fVar94 * auVar146._24_4_) * auVar117._8_4_ + 1.0;
            auVar109._28_4_ = auVar75._28_4_ + 1.0 + auVar115._28_4_ + 1.0;
            auVar130._8_4_ = 0x40000000;
            auVar130._0_8_ = 0x4000000040000000;
            auVar130._12_4_ = 0x40000000;
            auVar130._16_4_ = 0x40000000;
            auVar130._20_4_ = 0x40000000;
            auVar130._24_4_ = 0x40000000;
            auVar130._28_4_ = 0x40000000;
            auVar75 = vdivps_avx(auVar130,auVar109);
            auVar107._0_4_ = auVar75._0_4_ + -1.0;
            auVar107._4_4_ = auVar75._4_4_ + -1.0;
            auVar107._8_4_ = auVar75._8_4_ + -1.0;
            auVar107._12_4_ = auVar75._12_4_ + -1.0;
            auVar107._16_4_ = auVar75._16_4_ + -1.0;
            auVar107._20_4_ = auVar75._20_4_ + -1.0;
            auVar107._24_4_ = auVar75._24_4_ + -1.0;
            goto LAB_004e19a8;
          case 6:
            pfVar51 = (float *)(this->super_Convolution1D).activation_params.data;
            fVar203 = *pfVar51;
            fVar148 = pfVar51[1];
            auVar130._4_4_ = fVar148;
            auVar130._0_4_ = fVar148;
            auVar130._8_4_ = fVar148;
            auVar130._12_4_ = fVar148;
            auVar130._16_4_ = fVar148;
            auVar130._20_4_ = fVar148;
            auVar130._24_4_ = fVar148;
            auVar130._28_4_ = fVar148;
            auVar115._0_4_ = fVar203 * fVar196 + fVar148;
            auVar115._4_4_ = fVar203 * fVar197 + fVar148;
            auVar115._8_4_ = fVar203 * auVar90._8_4_ + fVar148;
            auVar115._12_4_ = fVar203 * auVar90._12_4_ + fVar148;
            auVar115._16_4_ = fVar203 * auVar90._16_4_ + fVar148;
            auVar115._20_4_ = fVar203 * auVar90._20_4_ + fVar148;
            auVar115._24_4_ = fVar203 * auVar90._24_4_ + fVar148;
            auVar115._28_4_ = fVar203 + fVar148;
            auVar75 = vmaxps_avx(auVar115,auVar75);
            auVar75 = vminps_avx(auVar75,auVar142);
            auVar107 = auVar75._0_28_;
LAB_004e19a8:
            in_ZMM3 = ZEXT3264(auVar130);
            auVar24._4_4_ = auVar107._4_4_ * fVar197;
            auVar24._0_4_ = auVar107._0_4_ * fVar196;
            auVar24._8_4_ = auVar107._8_4_ * auVar90._8_4_;
            auVar24._12_4_ = auVar107._12_4_ * auVar90._12_4_;
            auVar24._16_4_ = auVar107._16_4_ * auVar90._16_4_;
            auVar24._20_4_ = auVar107._20_4_ * auVar90._20_4_;
            auVar24._24_4_ = auVar107._24_4_ * auVar90._24_4_;
            auVar24._28_4_ = auVar146._28_4_;
            auVar146 = auVar24;
          }
switchD_004e1540_caseD_1:
          auVar132 = auVar146._16_16_;
          auVar117 = auVar146._0_16_;
          if (iVar68 == 1) {
            *(int *)*local_218 = auVar146._0_4_;
            uVar11 = vextractps_avx(auVar117,1);
            *(undefined4 *)((long)*local_218 + lVar55 * 4) = uVar11;
            uVar11 = vextractps_avx(auVar117,2);
            *(undefined4 *)((long)*local_218 + (long)(iVar39 * 2) * 4) = uVar11;
            uVar11 = vextractps_avx(auVar117,3);
            *(undefined4 *)((long)*local_218 + (long)(iVar39 * 3) * 4) = uVar11;
            *(int *)((long)*local_218 + (long)(iVar39 * 4) * 4) = auVar146._16_4_;
            uVar11 = vextractps_avx(auVar132,1);
            *(undefined4 *)((long)*local_218 + (long)(iVar39 * 5) * 4) = uVar11;
            uVar11 = vextractps_avx(auVar132,2);
            *(undefined4 *)((long)*local_218 + (long)(iVar39 * 6) * 4) = uVar11;
            uVar11 = vextractps_avx(auVar132,3);
            *(undefined4 *)((long)*local_218 + (long)(iVar39 * 7) * 4) = uVar11;
            local_218 = (undefined1 (*) [32])((long)*local_218 + 4);
          }
          else if (iVar68 == 4) {
            *(undefined1 (*) [16])*local_218 = auVar117;
            *(undefined1 (*) [16])((long)*local_218 + lVar55 * 4) = auVar132;
            local_218 = (undefined1 (*) [32])((long)*local_218 + 0x10);
          }
          else if (iVar68 == 8) {
            *local_218 = auVar146;
            local_218 = local_218 + 1;
          }
          iVar48 = iVar48 + local_88.elempack * iVar9;
          lVar60 = lVar60 + lVar1;
          local_200 = local_200 + lVar1;
        }
      }
      uVar30 = (long)(iVar50 + iVar49 * -8) / 4;
      lVar59 = lVar41 * uVar69 * 4;
      uVar56 = 0;
      iVar48 = (int)uVar30;
      uVar53 = 0;
      if (0 < iVar48) {
        uVar53 = uVar30 & 0xffffffff;
      }
      auVar76 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar180 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
      auVar187._8_4_ = 0x3f800000;
      auVar187._0_8_ = 0x3f8000003f800000;
      auVar187._12_4_ = 0x3f800000;
      for (; uVar56 != uVar53; uVar56 = uVar56 + 1) {
        uVar30 = (long)(iVar49 * 8) + uVar56 * 4;
        uVar45 = top_blob->w;
        iVar28 = top_blob->elempack;
        uVar43 = (int)uVar30 >> 0x1f;
        local_218 = (undefined1 (*) [32])
                    ((long)(int)((long)((ulong)uVar43 << 0x20 | uVar30 & 0xffffffff) / (long)iVar28)
                     * (long)(int)uVar45 * top_blob->elemsize + (long)top_blob->data);
        uVar66 = (ulong)uVar43 << 0x20 | uVar30 & 0xffffffff;
        lVar60 = (long)local_88.h * (long)local_88.elempack;
        lVar61 = 0;
        uVar54 = 0;
        if (0 < (int)uVar45) {
          uVar54 = (ulong)uVar45;
        }
        iVar52 = 0;
        local_1d0 = lVar47 * 4;
        for (uVar62 = 0; uVar62 != uVar54; uVar62 = uVar62 + 1) {
          fVar203 = 0.0;
          fVar148 = 0.0;
          fVar199 = 0.0;
          fVar200 = 0.0;
          fVar149 = 0.0;
          fVar196 = 0.0;
          fVar197 = 0.0;
          fVar198 = 0.0;
          if (pvVar12 != (void *)0x0) {
            pfVar51 = (float *)((long)pvVar12 + uVar30 * 4);
            fVar149 = *pfVar51;
            fVar196 = pfVar51[1];
            fVar197 = pfVar51[2];
            fVar198 = pfVar51[3];
          }
          pfVar65 = (float *)((this->weight_data_tm).cstep *
                              (long)(((int)((long)uVar66 % 8) >> 2) + (int)((long)uVar66 / 8)) *
                              (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          local_200._0_4_ = (int)uVar62;
          local_200._0_4_ = local_88.elempack * iVar9 * (int)local_200;
          lVar31 = (long)local_88.w *
                   CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
          lVar42 = (long)local_88.data + local_1d0;
          pfVar51 = (float *)((long)local_88.data + lVar61);
          uVar57 = 0;
          auVar175 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar181 = ZEXT1664(ZEXT816(0) << 0x40);
          while( true ) {
            local_210 = (int)lVar60;
            if (local_210 <= (int)((uint)uVar57 | 7)) break;
            lVar33 = (int)((long)((ulong)(uint)((int)(uint)uVar57 >> 0x1f) << 0x20 |
                                 uVar57 & 0xffffffff) / (long)local_88.elempack) * lVar31;
            if (local_88.elempack == 8) {
              pfVar32 = (float *)((long)local_88.data + lVar33 + (long)iVar52 * 4);
              uVar34 = uVar69;
              pfVar36 = pfVar65;
              while (iVar44 = (int)uVar34, uVar34 = (ulong)(iVar44 - 1), iVar44 != 0) {
                fVar201 = *pfVar32;
                fVar202 = pfVar32[1];
                fVar143 = pfVar32[2];
                fVar147 = pfVar32[3];
                fVar150 = pfVar32[4];
                fVar151 = pfVar32[5];
                fVar149 = fVar201 * *pfVar36 + fVar149 + fVar150 * pfVar36[0x10];
                fVar196 = fVar201 * pfVar36[1] + fVar196 + fVar150 * pfVar36[0x11];
                fVar197 = fVar201 * pfVar36[2] + fVar197 + fVar150 * pfVar36[0x12];
                fVar198 = fVar201 * pfVar36[3] + fVar198 + fVar150 * pfVar36[0x13];
                fVar201 = pfVar32[6];
                auVar181 = ZEXT1664(CONCAT412(fVar202 * pfVar36[7] + auVar181._12_4_ +
                                              fVar151 * pfVar36[0x17],
                                              CONCAT48(fVar202 * pfVar36[6] + auVar181._8_4_ +
                                                       fVar151 * pfVar36[0x16],
                                                       CONCAT44(fVar202 * pfVar36[5] +
                                                                auVar181._4_4_ +
                                                                fVar151 * pfVar36[0x15],
                                                                fVar202 * pfVar36[4] +
                                                                auVar181._0_4_ +
                                                                fVar151 * pfVar36[0x14]))));
                fVar202 = pfVar32[7];
                auVar175 = ZEXT1664(CONCAT412(fVar143 * pfVar36[0xb] + auVar175._12_4_ +
                                              fVar201 * pfVar36[0x1b],
                                              CONCAT48(fVar143 * pfVar36[10] + auVar175._8_4_ +
                                                       fVar201 * pfVar36[0x1a],
                                                       CONCAT44(fVar143 * pfVar36[9] +
                                                                auVar175._4_4_ +
                                                                fVar201 * pfVar36[0x19],
                                                                fVar143 * pfVar36[8] +
                                                                auVar175._0_4_ +
                                                                fVar201 * pfVar36[0x18]))));
                fVar199 = fVar202 * pfVar36[0x1c] + fVar147 * pfVar36[0xc] + fVar199;
                fVar200 = fVar202 * pfVar36[0x1d] + fVar147 * pfVar36[0xd] + fVar200;
                fVar203 = fVar202 * pfVar36[0x1e] + fVar147 * pfVar36[0xe] + fVar203;
                fVar148 = fVar202 * pfVar36[0x1f] + fVar147 * pfVar36[0xf] + fVar148;
                pfVar36 = pfVar36 + 0x20;
                pfVar32 = pfVar32 + iVar25;
              }
              pfVar65 = pfVar65 + uVar69 * 0x20;
            }
            else {
              pfVar32 = (float *)((long)local_88.data + lVar33 + (long)(int)local_200 * 4);
            }
            if (local_88.elempack == 4) {
              pfVar36 = pfVar32 + 3;
              pfVar37 = pfVar65;
              uVar34 = uVar69;
              while (iVar44 = (int)uVar34, uVar34 = (ulong)(iVar44 - 1), iVar44 != 0) {
                fVar201 = pfVar36[-3];
                fVar202 = pfVar36[-2];
                fVar143 = pfVar36[-1];
                fVar147 = *pfVar36;
                fVar150 = pfVar36[lVar47 + -3];
                fVar151 = pfVar36[lVar47 + -2];
                fVar149 = fVar201 * *pfVar37 + fVar149 + fVar150 * pfVar37[0x10];
                fVar196 = fVar201 * pfVar37[1] + fVar196 + fVar150 * pfVar37[0x11];
                fVar197 = fVar201 * pfVar37[2] + fVar197 + fVar150 * pfVar37[0x12];
                fVar198 = fVar201 * pfVar37[3] + fVar198 + fVar150 * pfVar37[0x13];
                fVar201 = pfVar36[lVar47 + -1];
                auVar181 = ZEXT1664(CONCAT412(fVar202 * pfVar37[7] + auVar181._12_4_ +
                                              fVar151 * pfVar37[0x17],
                                              CONCAT48(fVar202 * pfVar37[6] + auVar181._8_4_ +
                                                       fVar151 * pfVar37[0x16],
                                                       CONCAT44(fVar202 * pfVar37[5] +
                                                                auVar181._4_4_ +
                                                                fVar151 * pfVar37[0x15],
                                                                fVar202 * pfVar37[4] +
                                                                auVar181._0_4_ +
                                                                fVar151 * pfVar37[0x14]))));
                fVar202 = pfVar36[lVar47];
                auVar175 = ZEXT1664(CONCAT412(fVar143 * pfVar37[0xb] + auVar175._12_4_ +
                                              fVar201 * pfVar37[0x1b],
                                              CONCAT48(fVar143 * pfVar37[10] + auVar175._8_4_ +
                                                       fVar201 * pfVar37[0x1a],
                                                       CONCAT44(fVar143 * pfVar37[9] +
                                                                auVar175._4_4_ +
                                                                fVar201 * pfVar37[0x19],
                                                                fVar143 * pfVar37[8] +
                                                                auVar175._0_4_ +
                                                                fVar201 * pfVar37[0x18]))));
                fVar199 = fVar202 * pfVar37[0x1c] + fVar147 * pfVar37[0xc] + fVar199;
                fVar200 = fVar202 * pfVar37[0x1d] + fVar147 * pfVar37[0xd] + fVar200;
                fVar203 = fVar202 * pfVar37[0x1e] + fVar147 * pfVar37[0xe] + fVar203;
                fVar148 = fVar202 * pfVar37[0x1f] + fVar147 * pfVar37[0xf] + fVar148;
                pfVar37 = pfVar37 + 0x20;
                pfVar36 = pfVar36 + lVar41;
              }
              pfVar65 = pfVar65 + uVar69 * 0x20;
              pfVar32 = (float *)((long)pfVar32 + lVar59);
            }
            uVar34 = uVar69;
            pfVar36 = pfVar65;
            if (local_88.elempack == 1) {
              while ((int)uVar34 != 0) {
                fVar201 = *pfVar32;
                fVar202 = pfVar32[lVar47];
                fVar143 = pfVar32[iVar22];
                fVar147 = pfVar32[iVar8];
                fVar150 = pfVar32[iVar26];
                fVar151 = pfVar32[iVar18];
                fVar149 = fVar201 * *pfVar36 + fVar149 + fVar150 * pfVar36[0x10];
                fVar196 = fVar201 * pfVar36[1] + fVar196 + fVar150 * pfVar36[0x11];
                fVar197 = fVar201 * pfVar36[2] + fVar197 + fVar150 * pfVar36[0x12];
                fVar198 = fVar201 * pfVar36[3] + fVar198 + fVar150 * pfVar36[0x13];
                fVar201 = pfVar32[iVar27];
                auVar181 = ZEXT1664(CONCAT412(fVar202 * pfVar36[7] + auVar181._12_4_ +
                                              fVar151 * pfVar36[0x17],
                                              CONCAT48(fVar202 * pfVar36[6] + auVar181._8_4_ +
                                                       fVar151 * pfVar36[0x16],
                                                       CONCAT44(fVar202 * pfVar36[5] +
                                                                auVar181._4_4_ +
                                                                fVar151 * pfVar36[0x15],
                                                                fVar202 * pfVar36[4] +
                                                                auVar181._0_4_ +
                                                                fVar151 * pfVar36[0x14]))));
                fVar202 = pfVar32[iVar38];
                auVar175 = ZEXT1664(CONCAT412(fVar143 * pfVar36[0xb] + auVar175._12_4_ +
                                              fVar201 * pfVar36[0x1b],
                                              CONCAT48(fVar143 * pfVar36[10] + auVar175._8_4_ +
                                                       fVar201 * pfVar36[0x1a],
                                                       CONCAT44(fVar143 * pfVar36[9] +
                                                                auVar175._4_4_ +
                                                                fVar201 * pfVar36[0x19],
                                                                fVar143 * pfVar36[8] +
                                                                auVar175._0_4_ +
                                                                fVar201 * pfVar36[0x18]))));
                fVar199 = fVar202 * pfVar36[0x1c] + fVar147 * pfVar36[0xc] + fVar199;
                fVar200 = fVar202 * pfVar36[0x1d] + fVar147 * pfVar36[0xd] + fVar200;
                fVar203 = fVar202 * pfVar36[0x1e] + fVar147 * pfVar36[0xe] + fVar203;
                fVar148 = fVar202 * pfVar36[0x1f] + fVar147 * pfVar36[0xf] + fVar148;
                pfVar32 = pfVar32 + lVar70;
                uVar34 = (ulong)((int)uVar34 - 1);
                pfVar36 = pfVar36 + 0x20;
              }
              pfVar65 = pfVar65 + uVar69 * 0x20;
            }
            uVar57 = uVar57 + 8;
            lVar42 = lVar42 + lVar31 * 8;
            pfVar51 = pfVar51 + lVar31 * 2;
          }
          for (; (int)((uint)uVar57 | 3) < local_210; uVar57 = uVar57 + 4) {
            lVar33 = (int)((long)((ulong)(uint)((int)(uint)uVar57 >> 0x1f) << 0x20 |
                                 uVar57 & 0xffffffff) / (long)local_88.elempack) * lVar31;
            if (local_88.elempack == 4) {
              pfVar32 = (float *)((long)local_88.data + lVar33 + (long)iVar52 * 4);
              uVar34 = uVar69;
              pfVar36 = pfVar65;
              while (iVar44 = (int)uVar34, uVar34 = (ulong)(iVar44 - 1), iVar44 != 0) {
                fVar201 = *pfVar32;
                fVar202 = pfVar32[1];
                fVar149 = fVar201 * *pfVar36 + fVar149;
                fVar196 = fVar201 * pfVar36[1] + fVar196;
                fVar197 = fVar201 * pfVar36[2] + fVar197;
                fVar198 = fVar201 * pfVar36[3] + fVar198;
                fVar201 = pfVar32[2];
                auVar181 = ZEXT1664(CONCAT412(fVar202 * pfVar36[7] + auVar181._12_4_,
                                              CONCAT48(fVar202 * pfVar36[6] + auVar181._8_4_,
                                                       CONCAT44(fVar202 * pfVar36[5] +
                                                                auVar181._4_4_,
                                                                fVar202 * pfVar36[4] +
                                                                auVar181._0_4_))));
                fVar202 = pfVar32[3];
                auVar175 = ZEXT1664(CONCAT412(fVar201 * pfVar36[0xb] + auVar175._12_4_,
                                              CONCAT48(fVar201 * pfVar36[10] + auVar175._8_4_,
                                                       CONCAT44(fVar201 * pfVar36[9] +
                                                                auVar175._4_4_,
                                                                fVar201 * pfVar36[8] +
                                                                auVar175._0_4_))));
                fVar199 = fVar202 * pfVar36[0xc] + fVar199;
                fVar200 = fVar202 * pfVar36[0xd] + fVar200;
                fVar203 = fVar202 * pfVar36[0xe] + fVar203;
                fVar148 = fVar202 * pfVar36[0xf] + fVar148;
                pfVar36 = pfVar36 + 0x10;
                pfVar32 = pfVar32 + lVar41;
              }
              pfVar65 = pfVar65 + uVar69 * 0x10;
            }
            else {
              pfVar32 = (float *)((long)local_88.data + lVar33 + (long)(int)local_200 * 4);
            }
            uVar34 = uVar69;
            pfVar36 = pfVar65;
            if (local_88.elempack == 1) {
              while ((int)uVar34 != 0) {
                fVar201 = *pfVar32;
                fVar202 = pfVar32[lVar47];
                fVar149 = fVar201 * *pfVar36 + fVar149;
                fVar196 = fVar201 * pfVar36[1] + fVar196;
                fVar197 = fVar201 * pfVar36[2] + fVar197;
                fVar198 = fVar201 * pfVar36[3] + fVar198;
                fVar201 = pfVar32[iVar22];
                auVar181 = ZEXT1664(CONCAT412(fVar202 * pfVar36[7] + auVar181._12_4_,
                                              CONCAT48(fVar202 * pfVar36[6] + auVar181._8_4_,
                                                       CONCAT44(fVar202 * pfVar36[5] +
                                                                auVar181._4_4_,
                                                                fVar202 * pfVar36[4] +
                                                                auVar181._0_4_))));
                fVar202 = pfVar32[iVar8];
                auVar175 = ZEXT1664(CONCAT412(fVar201 * pfVar36[0xb] + auVar175._12_4_,
                                              CONCAT48(fVar201 * pfVar36[10] + auVar175._8_4_,
                                                       CONCAT44(fVar201 * pfVar36[9] +
                                                                auVar175._4_4_,
                                                                fVar201 * pfVar36[8] +
                                                                auVar175._0_4_))));
                fVar199 = fVar202 * pfVar36[0xc] + fVar199;
                fVar200 = fVar202 * pfVar36[0xd] + fVar200;
                fVar203 = fVar202 * pfVar36[0xe] + fVar203;
                fVar148 = fVar202 * pfVar36[0xf] + fVar148;
                pfVar32 = pfVar32 + lVar70;
                uVar34 = (ulong)((int)uVar34 - 1);
                pfVar36 = pfVar36 + 0x10;
              }
              pfVar65 = pfVar65 + uVar69 * 0x10;
            }
            lVar42 = lVar42 + lVar31 * 4;
            pfVar51 = pfVar51 + lVar31;
          }
          for (; (long)(uVar57 | 1) < lVar60; uVar57 = uVar57 + 2) {
            lVar33 = 0;
            uVar34 = uVar69;
            pfVar32 = pfVar65;
            while (iVar44 = (int)uVar34, uVar34 = (ulong)(iVar44 - 1), iVar44 != 0) {
              fVar201 = *(float *)((long)pfVar51 + lVar33);
              fVar202 = *(float *)(lVar42 + lVar33);
              fVar149 = fVar201 * *pfVar32 + fVar149;
              fVar196 = fVar201 * pfVar32[1] + fVar196;
              fVar197 = fVar201 * pfVar32[2] + fVar197;
              fVar198 = fVar201 * pfVar32[3] + fVar198;
              auVar181 = ZEXT1664(CONCAT412(fVar202 * pfVar32[7] + auVar181._12_4_,
                                            CONCAT48(fVar202 * pfVar32[6] + auVar181._8_4_,
                                                     CONCAT44(fVar202 * pfVar32[5] + auVar181._4_4_,
                                                              fVar202 * pfVar32[4] + auVar181._0_4_)
                                                    )));
              pfVar32 = pfVar32 + 8;
              lVar33 = lVar33 + lVar71;
            }
            pfVar65 = pfVar65 + uVar69 * 8;
            lVar42 = lVar42 + lVar31 * 2;
            pfVar51 = (float *)((long)pfVar51 + lVar31 * 2);
          }
          for (; uVar34 = uVar69, pfVar32 = pfVar51, pfVar36 = pfVar65, (long)uVar57 < lVar60;
              uVar57 = uVar57 + 1) {
            while ((int)uVar34 != 0) {
              fVar201 = *pfVar32;
              fVar149 = fVar201 * *pfVar36 + fVar149;
              fVar196 = fVar201 * pfVar36[1] + fVar196;
              fVar197 = fVar201 * pfVar36[2] + fVar197;
              fVar198 = fVar201 * pfVar36[3] + fVar198;
              uVar34 = (ulong)((int)uVar34 - 1);
              pfVar32 = pfVar32 + lVar70;
              pfVar36 = pfVar36 + 4;
            }
            pfVar65 = pfVar65 + uVar69 * 4;
            pfVar51 = (float *)((long)pfVar51 + lVar31);
          }
          auVar118._0_4_ = auVar181._0_4_ + fVar149 + auVar175._0_4_ + fVar199;
          auVar118._4_4_ = auVar181._4_4_ + fVar196 + auVar175._4_4_ + fVar200;
          auVar118._8_4_ = auVar181._8_4_ + fVar197 + auVar175._8_4_ + fVar203;
          auVar118._12_4_ = auVar181._12_4_ + fVar198 + auVar175._12_4_ + fVar148;
          auVar163 = auVar118;
          if (5 < iVar10 - 1U) goto switchD_004e2187_caseD_1;
          auVar167 = auVar76._0_16_;
          auVar163 = vmaxps_avx(auVar118,auVar167);
          fVar203 = auVar180._0_4_;
          fVar148 = auVar180._4_4_;
          fVar149 = auVar180._8_4_;
          fVar196 = auVar180._12_4_;
          switch(iVar10) {
          case 2:
            auVar167 = vminps_avx(auVar118,auVar167);
            fVar203 = *(this->super_Convolution1D).activation_params.data;
            auVar155._0_4_ = auVar163._0_4_ + fVar203 * auVar167._0_4_;
            auVar155._4_4_ = auVar163._4_4_ + fVar203 * auVar167._4_4_;
            auVar155._8_4_ = auVar163._8_4_ + fVar203 * auVar167._8_4_;
            auVar155._12_4_ = auVar163._12_4_ + fVar203 * auVar167._12_4_;
            auVar163 = auVar155;
            break;
          case 3:
            puVar63 = (undefined4 *)(this->super_Convolution1D).activation_params.data;
            uVar11 = *puVar63;
            auVar159._4_4_ = uVar11;
            auVar159._0_4_ = uVar11;
            auVar159._8_4_ = uVar11;
            auVar159._12_4_ = uVar11;
            uVar11 = puVar63[1];
            auVar172._4_4_ = uVar11;
            auVar172._0_4_ = uVar11;
            auVar172._8_4_ = uVar11;
            auVar172._12_4_ = uVar11;
            auVar167 = vmaxps_avx(auVar159,auVar118);
            auVar163 = vminps_avx(auVar172,auVar167);
            break;
          case 4:
            uVar57 = CONCAT44(auVar118._4_4_,auVar118._0_4_);
            auVar119._0_8_ = uVar57 ^ 0x8000000080000000;
            auVar119._8_4_ = -auVar118._8_4_;
            auVar119._12_4_ = -auVar118._12_4_;
            auVar80._8_4_ = 0x42b0c0a5;
            auVar80._0_8_ = 0x42b0c0a542b0c0a5;
            auVar80._12_4_ = 0x42b0c0a5;
            auVar167 = vminps_avx(auVar119,auVar80);
            auVar81._8_4_ = 0xc2b0c0a5;
            auVar81._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar81._12_4_ = 0xc2b0c0a5;
            auVar132 = vmaxps_avx(auVar167,auVar81);
            auVar160._0_4_ = auVar132._0_4_ * 1.442695 + fVar203;
            auVar160._4_4_ = auVar132._4_4_ * 1.442695 + fVar148;
            auVar160._8_4_ = auVar132._8_4_ * 1.442695 + fVar149;
            auVar160._12_4_ = auVar132._12_4_ * 1.442695 + fVar196;
            auVar173._0_4_ = (int)auVar160._0_4_;
            auVar173._4_4_ = (int)auVar160._4_4_;
            auVar173._8_4_ = (int)auVar160._8_4_;
            auVar173._12_4_ = (int)auVar160._12_4_;
            auVar117 = vcvtdq2ps_avx(auVar173);
            auVar167 = vcmpps_avx(auVar160,auVar117,1);
            auVar185._8_4_ = 0x3f800000;
            auVar185._0_8_ = 0x3f8000003f800000;
            auVar185._12_4_ = 0x3f800000;
            auVar167 = vandps_avx(auVar167,auVar185);
            auVar167 = vsubps_avx(auVar117,auVar167);
            fVar197 = auVar167._0_4_ * -0.6931472 + auVar132._0_4_;
            fVar198 = auVar167._4_4_ * -0.6931472 + auVar132._4_4_;
            fVar199 = auVar167._8_4_ * -0.6931472 + auVar132._8_4_;
            fVar200 = auVar167._12_4_ * -0.6931472 + auVar132._12_4_;
            auVar161._0_4_ = (int)auVar167._0_4_;
            auVar161._4_4_ = (int)auVar167._4_4_;
            auVar161._8_4_ = (int)auVar167._8_4_;
            auVar161._12_4_ = (int)auVar167._12_4_;
            auVar167 = vpslld_avx(auVar161,0x17);
            auVar167 = vpaddd_avx(auVar167,auVar185);
            auVar120._0_4_ =
                 auVar167._0_4_ *
                 (fVar197 * fVar197 *
                  (((((fVar197 * 0.00019875691 + 0.0013981999) * fVar197 + 0.008333452) * fVar197 +
                    0.041665796) * fVar197 + 0.16666666) * fVar197 + fVar203) + fVar197 + 1.0) + 1.0
            ;
            auVar120._4_4_ =
                 auVar167._4_4_ *
                 (fVar198 * fVar198 *
                  (((((fVar198 * 0.00019875691 + 0.0013981999) * fVar198 + 0.008333452) * fVar198 +
                    0.041665796) * fVar198 + 0.16666666) * fVar198 + fVar148) + fVar198 + 1.0) + 1.0
            ;
            auVar120._8_4_ =
                 auVar167._8_4_ *
                 (fVar199 * fVar199 *
                  (((((fVar199 * 0.00019875691 + 0.0013981999) * fVar199 + 0.008333452) * fVar199 +
                    0.041665796) * fVar199 + 0.16666666) * fVar199 + fVar149) + fVar199 + 1.0) + 1.0
            ;
            auVar120._12_4_ =
                 auVar167._12_4_ *
                 (fVar200 * fVar200 *
                  (((((fVar200 * 0.00019875691 + 0.0013981999) * fVar200 + 0.008333452) * fVar200 +
                    0.041665796) * fVar200 + 0.16666666) * fVar200 + fVar196) + fVar200 + 1.0) + 1.0
            ;
            auVar163 = vdivps_avx(auVar185,auVar120);
            break;
          case 5:
            auVar78._8_4_ = 0x42b0c0a5;
            auVar78._0_8_ = 0x42b0c0a542b0c0a5;
            auVar78._12_4_ = 0x42b0c0a5;
            auVar167 = vminps_avx(auVar118,auVar78);
            auVar135._8_4_ = 0xc2b0c0a5;
            auVar135._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar135._12_4_ = 0xc2b0c0a5;
            auVar132 = vmaxps_avx(auVar167,auVar135);
            auVar165._0_4_ = auVar132._0_4_ * 1.442695 + fVar203;
            auVar165._4_4_ = auVar132._4_4_ * 1.442695 + fVar148;
            auVar165._8_4_ = auVar132._8_4_ * 1.442695 + fVar149;
            auVar165._12_4_ = auVar132._12_4_ * 1.442695 + fVar196;
            auVar176._0_4_ = (int)auVar165._0_4_;
            auVar176._4_4_ = (int)auVar165._4_4_;
            auVar176._8_4_ = (int)auVar165._8_4_;
            auVar176._12_4_ = (int)auVar165._12_4_;
            auVar117 = vcvtdq2ps_avx(auVar176);
            auVar167 = vcmpps_avx(auVar165,auVar117,1);
            auVar167 = vandps_avx(auVar167,auVar187);
            auVar167 = vsubps_avx(auVar117,auVar167);
            auVar177._0_4_ = auVar167._0_4_ * 0.6931472;
            auVar177._4_4_ = auVar167._4_4_ * 0.6931472;
            auVar177._8_4_ = auVar167._8_4_ * 0.6931472;
            auVar177._12_4_ = auVar167._12_4_ * 0.6931472;
            auVar117 = vsubps_avx(auVar132,auVar177);
            fVar197 = auVar117._0_4_;
            fVar198 = auVar117._4_4_;
            fVar199 = auVar117._8_4_;
            fVar200 = auVar117._12_4_;
            auVar166._0_4_ = (int)auVar167._0_4_;
            auVar166._4_4_ = (int)auVar167._4_4_;
            auVar166._8_4_ = (int)auVar167._8_4_;
            auVar166._12_4_ = (int)auVar167._12_4_;
            auVar167 = vpslld_avx(auVar166,0x17);
            auVar167 = vpaddd_avx(auVar167,auVar187);
            auVar156._0_4_ =
                 (fVar197 + 1.0 +
                 fVar197 * fVar197 *
                 (((((fVar197 * 0.00019875691 + 0.0013981999) * fVar197 + 0.008333452) * fVar197 +
                   0.041665796) * fVar197 + 0.16666666) * fVar197 + fVar203)) * auVar167._0_4_ + 1.0
            ;
            auVar156._4_4_ =
                 (fVar198 + 1.0 +
                 fVar198 * fVar198 *
                 (((((fVar198 * 0.00019875691 + 0.0013981999) * fVar198 + 0.008333452) * fVar198 +
                   0.041665796) * fVar198 + 0.16666666) * fVar198 + fVar148)) * auVar167._4_4_ + 1.0
            ;
            auVar156._8_4_ =
                 (fVar199 + 1.0 +
                 fVar199 * fVar199 *
                 (((((fVar199 * 0.00019875691 + 0.0013981999) * fVar199 + 0.008333452) * fVar199 +
                   0.041665796) * fVar199 + 0.16666666) * fVar199 + fVar149)) * auVar167._8_4_ + 1.0
            ;
            auVar156._12_4_ =
                 (fVar200 + 1.0 +
                 fVar200 * fVar200 *
                 (((((fVar200 * 0.00019875691 + 0.0013981999) * fVar200 + 0.008333452) * fVar200 +
                   0.041665796) * fVar200 + 0.16666666) * fVar200 + fVar196)) * auVar167._12_4_ +
                 1.0;
            auVar168._8_4_ = 0x800000;
            auVar168._0_8_ = 0x80000000800000;
            auVar168._12_4_ = 0x800000;
            auVar167 = vmaxps_avx(auVar156,auVar168);
            auVar117 = vpsrld_avx(auVar167,0x17);
            auVar182._8_4_ = 0xffffff82;
            auVar182._0_8_ = 0xffffff82ffffff82;
            auVar182._12_4_ = 0xffffff82;
            auVar117 = vpaddd_avx(auVar117,auVar182);
            auVar183._8_4_ = 0x807fffff;
            auVar183._0_8_ = 0x807fffff807fffff;
            auVar183._12_4_ = 0x807fffff;
            auVar167 = vandps_avx(auVar167,auVar183);
            auVar133 = vorps_avx(auVar167,auVar180._0_16_);
            auVar132 = vcvtdq2ps_avx(auVar117);
            auVar184._8_4_ = 0x3f3504f3;
            auVar184._0_8_ = 0x3f3504f33f3504f3;
            auVar184._12_4_ = 0x3f3504f3;
            auVar117 = vcmpps_avx(auVar133,auVar184,1);
            auVar167 = vandps_avx(auVar117,auVar133);
            fVar197 = auVar133._0_4_ + -1.0 + auVar167._0_4_;
            fVar198 = auVar133._4_4_ + -1.0 + auVar167._4_4_;
            fVar199 = auVar133._8_4_ + -1.0 + auVar167._8_4_;
            fVar200 = auVar133._12_4_ + -1.0 + auVar167._12_4_;
            auVar167 = vandps_avx(auVar117,auVar187);
            auVar117 = vsubps_avx(auVar132,auVar167);
            auVar167 = vcmpps_avx(auVar156,_DAT_005442b0,2);
            auVar169._0_4_ =
                 (auVar117._0_4_ * 0.6931472 + fVar197 +
                 fVar197 * fVar197 *
                 (((((((((fVar197 * 0.070376836 + -0.1151461) * fVar197 + 0.116769984) * fVar197 +
                       -0.12420141) * fVar197 + 0.14249323) * fVar197 + -0.16668057) * fVar197 +
                    0.20000714) * fVar197 + -0.24999994) * fVar197 + 0.3333333) * fVar197 + -0.5)) *
                 -2.0;
            auVar169._4_4_ =
                 (auVar117._4_4_ * 0.6931472 + fVar198 +
                 fVar198 * fVar198 *
                 (((((((((fVar198 * 0.070376836 + -0.1151461) * fVar198 + 0.116769984) * fVar198 +
                       -0.12420141) * fVar198 + 0.14249323) * fVar198 + -0.16668057) * fVar198 +
                    0.20000714) * fVar198 + -0.24999994) * fVar198 + 0.3333333) * fVar198 + -0.5)) *
                 -2.0;
            auVar169._8_4_ =
                 (auVar117._8_4_ * 0.6931472 + fVar199 +
                 fVar199 * fVar199 *
                 (((((((((fVar199 * 0.070376836 + -0.1151461) * fVar199 + 0.116769984) * fVar199 +
                       -0.12420141) * fVar199 + 0.14249323) * fVar199 + -0.16668057) * fVar199 +
                    0.20000714) * fVar199 + -0.24999994) * fVar199 + 0.3333333) * fVar199 + -0.5)) *
                 -2.0;
            auVar169._12_4_ =
                 (auVar117._12_4_ * 0.6931472 + fVar200 +
                 fVar200 * fVar200 *
                 (((((((((fVar200 * 0.070376836 + -0.1151461) * fVar200 + 0.116769984) * fVar200 +
                       -0.12420141) * fVar200 + 0.14249323) * fVar200 + -0.16668057) * fVar200 +
                    0.20000714) * fVar200 + -0.24999994) * fVar200 + 0.3333333) * fVar200 + -0.5)) *
                 -2.0;
            auVar136._8_4_ = 0x7fffffff;
            auVar136._0_8_ = 0x7fffffff7fffffff;
            auVar136._12_4_ = 0x7fffffff;
            auVar167 = vblendvps_avx(auVar169,auVar136,auVar167);
            auVar137._8_4_ = 0x42b0c0a5;
            auVar137._0_8_ = 0x42b0c0a542b0c0a5;
            auVar137._12_4_ = 0x42b0c0a5;
            auVar167 = vminps_avx(auVar167,auVar137);
            auVar138._8_4_ = 0xc2b0c0a5;
            auVar138._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar138._12_4_ = 0xc2b0c0a5;
            in_ZMM4 = ZEXT1664(auVar138);
            auVar132 = vmaxps_avx(auVar167,auVar138);
            auVar170._0_4_ = auVar132._0_4_ * 1.442695 + fVar203;
            auVar170._4_4_ = auVar132._4_4_ * 1.442695 + fVar148;
            auVar170._8_4_ = auVar132._8_4_ * 1.442695 + fVar149;
            auVar170._12_4_ = auVar132._12_4_ * 1.442695 + fVar196;
            auVar178._0_4_ = (int)auVar170._0_4_;
            auVar178._4_4_ = (int)auVar170._4_4_;
            auVar178._8_4_ = (int)auVar170._8_4_;
            auVar178._12_4_ = (int)auVar170._12_4_;
            auVar117 = vcvtdq2ps_avx(auVar178);
            auVar167 = vcmpps_avx(auVar170,auVar117,1);
            auVar167 = vandps_avx(auVar167,auVar187);
            auVar167 = vsubps_avx(auVar117,auVar167);
            auVar179._0_4_ = auVar167._0_4_ * 0.6931472;
            auVar179._4_4_ = auVar167._4_4_ * 0.6931472;
            auVar179._8_4_ = auVar167._8_4_ * 0.6931472;
            auVar179._12_4_ = auVar167._12_4_ * 0.6931472;
            auVar117 = vsubps_avx(auVar132,auVar179);
            fVar197 = auVar117._0_4_;
            fVar198 = auVar117._4_4_;
            fVar199 = auVar117._8_4_;
            fVar200 = auVar117._12_4_;
            auVar76 = ZEXT864(0) << 0x20;
            auVar180 = ZEXT1664(auVar180._0_16_);
            auVar171._0_4_ = (int)auVar167._0_4_;
            auVar171._4_4_ = (int)auVar167._4_4_;
            auVar171._8_4_ = (int)auVar167._8_4_;
            auVar171._12_4_ = (int)auVar167._12_4_;
            auVar167 = vpslld_avx(auVar171,0x17);
            auVar167 = vpaddd_avx(auVar167,auVar187);
            auVar157._0_4_ =
                 (fVar197 + 1.0 +
                 fVar197 * fVar197 *
                 (((((fVar197 * 0.00019875691 + 0.0013981999) * fVar197 + 0.008333452) * fVar197 +
                   0.041665796) * fVar197 + 0.16666666) * fVar197 + fVar203)) * auVar167._0_4_ + 1.0
            ;
            auVar157._4_4_ =
                 (fVar198 + 1.0 +
                 fVar198 * fVar198 *
                 (((((fVar198 * 0.00019875691 + 0.0013981999) * fVar198 + 0.008333452) * fVar198 +
                   0.041665796) * fVar198 + 0.16666666) * fVar198 + fVar148)) * auVar167._4_4_ + 1.0
            ;
            auVar157._8_4_ =
                 (fVar199 + 1.0 +
                 fVar199 * fVar199 *
                 (((((fVar199 * 0.00019875691 + 0.0013981999) * fVar199 + 0.008333452) * fVar199 +
                   0.041665796) * fVar199 + 0.16666666) * fVar199 + fVar149)) * auVar167._8_4_ + 1.0
            ;
            auVar157._12_4_ =
                 (fVar200 + 1.0 +
                 fVar200 * fVar200 *
                 (((((fVar200 * 0.00019875691 + 0.0013981999) * fVar200 + 0.008333452) * fVar200 +
                   0.041665796) * fVar200 + 0.16666666) * fVar200 + fVar196)) * auVar167._12_4_ +
                 1.0;
            auVar79._8_4_ = 0x40000000;
            auVar79._0_8_ = 0x4000000040000000;
            auVar79._12_4_ = 0x40000000;
            auVar167 = vdivps_avx(auVar79,auVar157);
            auVar158._0_4_ = auVar167._0_4_ + -1.0;
            auVar158._4_4_ = auVar167._4_4_ + -1.0;
            auVar158._8_4_ = auVar167._8_4_ + -1.0;
            auVar158._12_4_ = auVar167._12_4_ + -1.0;
            goto LAB_004e25cf;
          case 6:
            pfVar51 = (float *)(this->super_Convolution1D).activation_params.data;
            fVar203 = *pfVar51;
            fVar148 = pfVar51[1];
            auVar162._0_4_ = fVar203 * auVar118._0_4_ + fVar148;
            auVar162._4_4_ = fVar203 * auVar118._4_4_ + fVar148;
            auVar162._8_4_ = fVar203 * auVar118._8_4_ + fVar148;
            auVar162._12_4_ = fVar203 * auVar118._12_4_ + fVar148;
            auVar167 = vmaxps_avx(auVar162,auVar167);
            auVar174._8_4_ = 0x3f800000;
            auVar174._0_8_ = 0x3f8000003f800000;
            auVar174._12_4_ = 0x3f800000;
            auVar158 = vminps_avx(auVar167,auVar174);
LAB_004e25cf:
            auVar163._0_4_ = auVar158._0_4_ * auVar118._0_4_;
            auVar163._4_4_ = auVar158._4_4_ * auVar118._4_4_;
            auVar163._8_4_ = auVar158._8_4_ * auVar118._8_4_;
            auVar163._12_4_ = auVar158._12_4_ * auVar118._12_4_;
          }
switchD_004e2187_caseD_1:
          if (iVar28 == 1) {
            *(int *)*local_218 = auVar163._0_4_;
            uVar11 = vextractps_avx(auVar163,1);
            *(undefined4 *)((long)*local_218 + lVar55 * 4) = uVar11;
            uVar11 = vextractps_avx(auVar163,2);
            *(undefined4 *)((long)*local_218 + (long)(iVar39 * 2) * 4) = uVar11;
            uVar11 = vextractps_avx(auVar163,3);
            *(undefined4 *)((long)*local_218 + (long)(iVar39 * 3) * 4) = uVar11;
            local_218 = (undefined1 (*) [32])((long)*local_218 + 4);
          }
          else if (iVar28 == 4) {
            *(undefined1 (*) [16])local_218 = auVar163;
            local_218 = (undefined1 (*) [32])((long)local_218 + 0x10);
          }
          iVar52 = iVar52 + local_88.elempack * iVar9;
          local_1d0 = local_1d0 + lVar1;
          lVar61 = lVar61 + lVar1;
        }
      }
      iVar49 = iVar49 * 8 + iVar48 * 4;
      uVar30 = (long)(iVar50 - iVar49) / 2;
      lVar55 = (long)local_88.h * (long)local_88.elempack;
      uVar45 = top_blob->w;
      lVar60 = (long)(int)uVar45 * top_blob->elemsize;
      pvVar13 = top_blob->data;
      iVar39 = local_88.elempack * iVar9;
      uVar53 = 0;
      uVar56 = 0;
      if (0 < (int)uVar45) {
        uVar56 = (ulong)uVar45;
      }
      iVar50 = (int)uVar30;
      uVar66 = 0;
      if (0 < iVar50) {
        uVar66 = uVar30 & 0xffffffff;
      }
      for (; uVar53 != uVar66; uVar53 = uVar53 + 1) {
        uVar30 = (long)iVar49 + uVar53 * 2;
        uVar45 = (int)uVar30 >> 0x1f;
        uVar54 = (ulong)uVar45 << 0x20 | uVar30 & 0xffffffff;
        puVar63 = (undefined4 *)(uVar30 * lVar60 + (long)pvVar13);
        sVar14 = (this->weight_data_tm).cstep;
        sVar15 = (this->weight_data_tm).elemsize;
        puVar67 = (undefined4 *)(((long)iVar49 + uVar53 * 2 + 1) * lVar60 + (long)pvVar13);
        pvVar16 = (this->weight_data_tm).data;
        pfVar51 = (float *)(this->super_Convolution1D).activation_params.data;
        lVar42 = 0;
        iVar48 = 0;
        lVar61 = lVar47 * 4;
        for (uVar62 = 0; uVar62 != uVar56; uVar62 = uVar62 + 1) {
          if (pvVar12 == (void *)0x0) {
            fVar203 = 0.0;
            fVar148 = 0.0;
          }
          else {
            pfVar65 = (float *)((long)pvVar12 + uVar30 * 4);
            fVar203 = *pfVar65;
            fVar148 = pfVar65[1];
          }
          iVar28 = iVar39 * (int)uVar62;
          lVar33 = (long)local_88.w *
                   CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
          lVar31 = (long)local_88.data + lVar61;
          pfVar32 = (float *)((long)local_88.data + lVar42);
          fVar149 = 0.0;
          fVar196 = 0.0;
          fVar199 = 0.0;
          fVar200 = 0.0;
          fVar201 = 0.0;
          fVar202 = 0.0;
          fVar143 = 0.0;
          fVar147 = 0.0;
          uVar57 = 0;
          fVar197 = 0.0;
          fVar198 = 0.0;
          fVar150 = 0.0;
          fVar151 = 0.0;
          fVar152 = 0.0;
          fVar153 = 0.0;
          fVar94 = 0.0;
          fVar95 = 0.0;
          pfVar65 = (float *)((long)(((int)((long)((ulong)uVar45 << 0x20 | uVar30 & 0xffffffff) % 4)
                                     >> 1) + (int)((long)uVar54 / 8) +
                                    (int)(char)((char)((long)uVar54 % 8) / '\x04')) * sVar14 *
                              sVar15 + (long)pvVar16);
          while( true ) {
            local_1f8 = (int)lVar55;
            if (local_1f8 <= (int)((uint)uVar57 | 7)) break;
            lVar35 = (int)((long)((ulong)(uint)((int)(uint)uVar57 >> 0x1f) << 0x20 |
                                 uVar57 & 0xffffffff) / (long)iVar7) * lVar33;
            if (iVar7 == 8) {
              pfVar36 = (float *)((long)local_88.data + lVar35 + (long)iVar48 * 4);
              uVar34 = uVar69;
              pfVar37 = pfVar65;
              while (iVar52 = (int)uVar34, uVar34 = (ulong)(iVar52 - 1), iVar52 != 0) {
                auVar175._0_4_ = *pfVar36 * *pfVar37;
                auVar175._4_4_ = pfVar36[1] * pfVar37[1];
                auVar175._8_4_ = pfVar36[2] * pfVar37[2];
                auVar175._12_4_ = pfVar36[3] * pfVar37[3];
                auVar175._16_4_ = pfVar36[4] * pfVar37[4];
                auVar175._20_4_ = pfVar36[5] * pfVar37[5];
                auVar175._28_36_ = in_ZMM4._28_36_;
                auVar175._24_4_ = pfVar36[6] * pfVar37[6];
                fVar199 = auVar175._0_4_ + fVar199;
                fVar200 = auVar175._4_4_ + fVar200;
                fVar149 = auVar175._8_4_ + fVar149;
                fVar196 = auVar175._12_4_ + fVar196;
                fVar201 = auVar175._16_4_ + fVar201;
                fVar202 = auVar175._20_4_ + fVar202;
                fVar143 = auVar175._24_4_ + fVar143;
                fVar147 = in_ZMM4._28_4_ + fVar147;
                fVar150 = *pfVar36 * pfVar37[8] + fVar150;
                fVar151 = pfVar36[1] * pfVar37[9] + fVar151;
                fVar197 = pfVar36[2] * pfVar37[10] + fVar197;
                fVar198 = pfVar36[3] * pfVar37[0xb] + fVar198;
                fVar152 = pfVar36[4] * pfVar37[0xc] + fVar152;
                fVar153 = pfVar36[5] * pfVar37[0xd] + fVar153;
                fVar94 = pfVar36[6] * pfVar37[0xe] + fVar94;
                fVar95 = pfVar36[7] + fVar95;
                pfVar37 = pfVar37 + 0x10;
                pfVar36 = pfVar36 + iVar25;
                in_ZMM4 = ZEXT3264(auVar175._0_32_);
              }
              pfVar65 = pfVar65 + uVar69 * 0x10;
            }
            else {
              pfVar36 = (float *)((long)local_88.data + lVar35 + (long)iVar28 * 4);
            }
            uVar34 = uVar69;
            pfVar37 = pfVar65;
            pfVar58 = pfVar36;
            if (iVar7 == 4) {
              while ((int)uVar34 != 0) {
                auVar181._0_4_ = *pfVar58 * *pfVar37;
                auVar181._4_4_ = pfVar58[1] * pfVar37[1];
                auVar181._8_4_ = pfVar58[2] * pfVar37[2];
                auVar181._12_4_ = pfVar58[3] * pfVar37[3];
                auVar181._16_4_ = pfVar58[lVar47 + 4] * pfVar37[4];
                auVar181._20_4_ = pfVar58[lVar47 + 5] * pfVar37[5];
                auVar181._28_36_ = in_ZMM4._28_36_;
                auVar181._24_4_ = pfVar58[lVar47 + 6] * pfVar37[6];
                fVar199 = auVar181._0_4_ + fVar199;
                fVar200 = auVar181._4_4_ + fVar200;
                fVar149 = auVar181._8_4_ + fVar149;
                fVar196 = auVar181._12_4_ + fVar196;
                fVar201 = auVar181._16_4_ + fVar201;
                fVar202 = auVar181._20_4_ + fVar202;
                fVar143 = auVar181._24_4_ + fVar143;
                fVar147 = in_ZMM4._28_4_ + fVar147;
                fVar150 = *pfVar58 * pfVar37[8] + fVar150;
                fVar151 = pfVar58[1] * pfVar37[9] + fVar151;
                fVar197 = pfVar58[2] * pfVar37[10] + fVar197;
                fVar198 = pfVar58[3] * pfVar37[0xb] + fVar198;
                fVar152 = pfVar58[lVar47 + 4] * pfVar37[0xc] + fVar152;
                fVar153 = pfVar58[lVar47 + 5] * pfVar37[0xd] + fVar153;
                fVar94 = pfVar58[lVar47 + 6] * pfVar37[0xe] + fVar94;
                fVar95 = pfVar58[lVar47 + 7] + fVar95;
                uVar34 = (ulong)((int)uVar34 - 1);
                pfVar37 = pfVar37 + 0x10;
                pfVar58 = pfVar58 + lVar41;
                in_ZMM4 = ZEXT3264(auVar181._0_32_);
              }
              pfVar65 = pfVar65 + uVar69 * 0x10;
              pfVar36 = (float *)((long)pfVar36 + lVar59);
            }
            if (iVar7 == 1) {
              pfVar37 = pfVar65 + 8;
              uVar34 = uVar69;
              while (iVar52 = (int)uVar34, uVar34 = (ulong)(iVar52 - 1), iVar52 != 0) {
                auVar167 = vinsertps_avx(ZEXT416((uint)*pfVar36),ZEXT416((uint)pfVar36[lVar47]),0x10
                                        );
                auVar167 = vinsertps_avx(auVar167,ZEXT416((uint)pfVar36[iVar22]),0x20);
                auVar167 = vinsertps_avx(auVar167,ZEXT416((uint)pfVar36[iVar8]),0x30);
                auVar117 = vinsertps_avx(ZEXT416((uint)pfVar36[iVar26]),
                                         ZEXT416((uint)pfVar36[iVar18]),0x10);
                auVar117 = vinsertps_avx(auVar117,ZEXT416((uint)pfVar36[iVar27]),0x20);
                auVar117 = vinsertps_avx(auVar117,ZEXT416((uint)pfVar36[iVar38]),0x30);
                fVar190 = auVar167._0_4_ * pfVar37[-8];
                fVar191 = auVar167._4_4_ * pfVar37[-7];
                fVar77 = auVar167._8_4_ * pfVar37[-6];
                fVar93 = auVar167._12_4_ * pfVar37[-5];
                fVar96 = auVar117._0_4_ * pfVar37[-4];
                fVar97 = auVar117._4_4_ * pfVar37[-3];
                fVar98 = auVar117._8_4_ * pfVar37[-2];
                in_ZMM4 = ZEXT2864(CONCAT424(fVar98,CONCAT420(fVar97,CONCAT416(fVar96,CONCAT412(
                                                  fVar93,CONCAT48(fVar77,CONCAT44(fVar191,fVar190)))
                                                  ))));
                fVar199 = fVar190 + fVar199;
                fVar200 = fVar191 + fVar200;
                fVar149 = fVar77 + fVar149;
                fVar196 = fVar93 + fVar196;
                fVar201 = fVar96 + fVar201;
                fVar202 = fVar97 + fVar202;
                fVar143 = fVar98 + fVar143;
                fVar147 = fVar147 + 0.0;
                fVar150 = auVar167._0_4_ * *pfVar37 + fVar150;
                fVar151 = auVar167._4_4_ * pfVar37[1] + fVar151;
                fVar197 = auVar167._8_4_ * pfVar37[2] + fVar197;
                fVar198 = auVar167._12_4_ * pfVar37[3] + fVar198;
                fVar152 = auVar117._0_4_ * pfVar37[4] + fVar152;
                fVar153 = auVar117._4_4_ * pfVar37[5] + fVar153;
                fVar94 = auVar117._8_4_ * pfVar37[6] + fVar94;
                fVar95 = auVar117._12_4_ + fVar95;
                pfVar37 = pfVar37 + 0x10;
                pfVar36 = pfVar36 + lVar70;
              }
              pfVar65 = pfVar65 + uVar69 * 0x10;
            }
            uVar57 = uVar57 + 8;
            lVar31 = lVar31 + lVar33 * 8;
            pfVar32 = pfVar32 + lVar33 * 2;
          }
          auVar82._0_4_ = fVar201 + fVar199;
          auVar82._4_4_ = fVar202 + fVar200;
          auVar82._8_4_ = fVar143 + fVar149;
          auVar82._12_4_ = fVar147 + fVar196;
          auVar167 = vshufpd_avx(auVar82,auVar82,1);
          auVar83._0_4_ = auVar167._0_4_ + auVar82._0_4_;
          auVar83._4_4_ = auVar167._4_4_ + auVar82._4_4_;
          auVar83._8_4_ = auVar167._8_4_ + auVar82._8_4_;
          auVar83._12_4_ = auVar167._12_4_ + auVar82._12_4_;
          auVar101._0_4_ = fVar152 + fVar150;
          auVar101._4_4_ = fVar153 + fVar151;
          auVar101._8_4_ = fVar94 + fVar197;
          auVar101._12_4_ = fVar95 + fVar198;
          auVar167 = vshufpd_avx(auVar101,auVar101,1);
          auVar102._0_4_ = auVar167._0_4_ + auVar101._0_4_;
          auVar102._4_4_ = auVar167._4_4_ + auVar101._4_4_;
          auVar102._8_4_ = auVar167._8_4_ + auVar101._8_4_;
          auVar102._12_4_ = auVar167._12_4_ + auVar101._12_4_;
          auVar76 = ZEXT864(0) << 0x40;
          auVar180 = ZEXT864(0) << 0x40;
          for (; (int)((uint)uVar57 | 3) < local_1f8; uVar57 = uVar57 + 4) {
            lVar35 = (int)((long)((ulong)(uint)((int)(uint)uVar57 >> 0x1f) << 0x20 |
                                 uVar57 & 0xffffffff) / (long)iVar7) * lVar33;
            if (iVar7 == 4) {
              pfVar36 = (float *)((long)local_88.data + lVar35 + (long)iVar48 * 4);
              uVar34 = uVar69;
              pfVar37 = pfVar65;
              while (iVar52 = (int)uVar34, uVar34 = (ulong)(iVar52 - 1), iVar52 != 0) {
                auVar76 = ZEXT1664(CONCAT412(pfVar36[3] * pfVar37[3] + auVar76._12_4_,
                                             CONCAT48(pfVar36[2] * pfVar37[2] + auVar76._8_4_,
                                                      CONCAT44(pfVar36[1] * pfVar37[1] +
                                                               auVar76._4_4_,
                                                               *pfVar36 * *pfVar37 + auVar76._0_4_))
                                            ));
                auVar180 = ZEXT1664(CONCAT412(pfVar36[3] * pfVar37[7] + auVar180._12_4_,
                                              CONCAT48(pfVar36[2] * pfVar37[6] + auVar180._8_4_,
                                                       CONCAT44(pfVar36[1] * pfVar37[5] +
                                                                auVar180._4_4_,
                                                                *pfVar36 * pfVar37[4] +
                                                                auVar180._0_4_))));
                pfVar37 = pfVar37 + 8;
                pfVar36 = pfVar36 + lVar41;
              }
              pfVar65 = pfVar65 + uVar69 * 8;
            }
            else {
              pfVar36 = (float *)((long)local_88.data + lVar35 + (long)iVar28 * 4);
            }
            uVar34 = uVar69;
            pfVar37 = pfVar65;
            if (iVar7 == 1) {
              while ((int)uVar34 != 0) {
                auVar167 = vinsertps_avx(ZEXT416((uint)*pfVar36),ZEXT416((uint)pfVar36[lVar47]),0x10
                                        );
                auVar167 = vinsertps_avx(auVar167,ZEXT416((uint)pfVar36[iVar22]),0x20);
                auVar167 = vinsertps_avx(auVar167,ZEXT416((uint)pfVar36[iVar8]),0x30);
                auVar76 = ZEXT1664(CONCAT412(auVar167._12_4_ * pfVar37[3] + auVar76._12_4_,
                                             CONCAT48(auVar167._8_4_ * pfVar37[2] + auVar76._8_4_,
                                                      CONCAT44(auVar167._4_4_ * pfVar37[1] +
                                                               auVar76._4_4_,
                                                               auVar167._0_4_ * *pfVar37 +
                                                               auVar76._0_4_))));
                auVar180 = ZEXT1664(CONCAT412(auVar167._12_4_ * pfVar37[7] + auVar180._12_4_,
                                              CONCAT48(auVar167._8_4_ * pfVar37[6] + auVar180._8_4_,
                                                       CONCAT44(auVar167._4_4_ * pfVar37[5] +
                                                                auVar180._4_4_,
                                                                auVar167._0_4_ * pfVar37[4] +
                                                                auVar180._0_4_))));
                pfVar36 = pfVar36 + lVar70;
                uVar34 = (ulong)((int)uVar34 - 1);
                pfVar37 = pfVar37 + 8;
              }
              pfVar65 = pfVar65 + uVar69 * 8;
            }
            lVar31 = lVar31 + lVar33 * 4;
            pfVar32 = pfVar32 + lVar33;
          }
          auVar167 = vshufpd_avx(auVar76._0_16_,auVar76._0_16_,1);
          auVar121._0_4_ = auVar167._0_4_ + auVar76._0_4_;
          auVar121._4_4_ = auVar167._4_4_ + auVar76._4_4_;
          auVar121._8_4_ = auVar167._8_4_ + auVar76._8_4_;
          auVar121._12_4_ = auVar167._12_4_ + auVar76._12_4_;
          auVar167 = vshufpd_avx(auVar180._0_16_,auVar180._0_16_,1);
          auVar139._0_4_ = auVar167._0_4_ + auVar180._0_4_;
          auVar139._4_4_ = auVar167._4_4_ + auVar180._4_4_;
          auVar139._8_4_ = auVar167._8_4_ + auVar180._8_4_;
          auVar139._12_4_ = auVar167._12_4_ + auVar180._12_4_;
          in_ZMM4 = ZEXT1664(auVar139);
          auVar167 = vinsertps_avx(auVar102,auVar83,0x4c);
          auVar117 = vinsertps_avx(auVar83,auVar102,0x1c);
          auVar132 = vinsertps_avx(auVar139,auVar121,0x4c);
          auVar133 = vinsertps_avx(auVar121,auVar139,0x1c);
          auVar76 = ZEXT1664(CONCAT412(auVar167._12_4_ + 0.0 + auVar117._12_4_ +
                                       auVar132._12_4_ + auVar133._12_4_,
                                       CONCAT48(auVar167._8_4_ + 0.0 + auVar117._8_4_ +
                                                auVar132._8_4_ + auVar133._8_4_,
                                                CONCAT44(auVar167._4_4_ + fVar148 + auVar117._4_4_ +
                                                         auVar132._4_4_ + auVar133._4_4_,
                                                         auVar167._0_4_ + fVar203 + auVar117._0_4_ +
                                                         auVar132._0_4_ + auVar133._0_4_))));
          for (; (long)(uVar57 | 1) < lVar55; uVar57 = uVar57 + 2) {
            lVar35 = 0;
            uVar34 = uVar69;
            pfVar36 = pfVar65;
            while (iVar28 = (int)uVar34, uVar34 = (ulong)(iVar28 - 1), iVar28 != 0) {
              fVar203 = *(float *)((long)pfVar32 + lVar35);
              fVar148 = *(float *)(lVar31 + lVar35);
              auVar76 = ZEXT1664(CONCAT412(fVar203 * 0.0 + auVar76._12_4_ + fVar148 * 0.0,
                                           CONCAT48(fVar203 * 0.0 + auVar76._8_4_ + fVar148 * 0.0,
                                                    CONCAT44((float)((ulong)*(undefined8 *)pfVar36
                                                                    >> 0x20) * fVar203 +
                                                             auVar76._4_4_ +
                                                             (float)((ulong)*(undefined8 *)
                                                                             (pfVar36 + 2) >> 0x20)
                                                             * fVar148,
                                                             (float)*(undefined8 *)pfVar36 * fVar203
                                                             + auVar76._0_4_ +
                                                             (float)*(undefined8 *)(pfVar36 + 2) *
                                                             fVar148))));
              pfVar36 = pfVar36 + 4;
              lVar35 = lVar35 + lVar71;
            }
            pfVar65 = pfVar65 + uVar69 * 4;
            lVar31 = lVar31 + lVar33 * 2;
            pfVar32 = (float *)((long)pfVar32 + lVar33 * 2);
          }
          for (; auVar141 = auVar76._0_16_, (long)uVar57 < lVar55; uVar57 = uVar57 + 1) {
            pfVar36 = pfVar32;
            for (lVar31 = 0; iVar68 != (int)lVar31; lVar31 = lVar31 + 1) {
              fVar203 = *pfVar36;
              auVar76 = ZEXT1664(CONCAT412(fVar203 * 0.0 + auVar76._12_4_,
                                           CONCAT48(fVar203 * 0.0 + auVar76._8_4_,
                                                    CONCAT44((float)((ulong)*(undefined8 *)
                                                                             (pfVar65 + lVar31 * 2)
                                                                    >> 0x20) * fVar203 +
                                                             auVar76._4_4_,
                                                             (float)*(undefined8 *)
                                                                     (pfVar65 + lVar31 * 2) *
                                                             fVar203 + auVar76._0_4_))));
              pfVar36 = pfVar36 + lVar70;
            }
            pfVar65 = pfVar65 + uVar69 * 2;
            pfVar32 = (float *)((long)pfVar32 + lVar33);
          }
          if (5 < iVar10 - 1U) goto LAB_004e2dc8;
          auVar167 = vmovshdup_avx(auVar141);
          fVar203 = auVar76._0_4_;
          fVar148 = auVar167._0_4_;
          switch(iVar10) {
          case 1:
            auVar141 = vmaxps_avx(auVar141,_DAT_005442b0);
            break;
          case 2:
            auVar167 = vcmpps_avx(ZEXT816(0) << 0x40,auVar141,1);
            fVar148 = *pfVar51;
            auVar86._4_4_ = fVar148;
            auVar86._0_4_ = fVar148;
            auVar86._8_4_ = fVar148;
            auVar86._12_4_ = fVar148;
            auVar103._8_4_ = 0x3f800000;
            auVar103._0_8_ = 0x3f8000003f800000;
            auVar103._12_4_ = 0x3f800000;
            auVar167 = vblendvps_avx(auVar86,auVar103,auVar167);
            goto LAB_004e2db6;
          case 3:
            auVar72._8_8_ = 0;
            auVar72._0_8_ = *(ulong *)pfVar51;
            auVar133 = vmaxss_avx(auVar72,auVar141);
            auVar117 = vinsertps_avx(auVar72,auVar133,0x10);
            auVar132 = vinsertps_avx(auVar167,auVar72,0x50);
            auVar117 = vcmpps_avx(auVar132,auVar117,1);
            auVar167 = vinsertps_avx(auVar167,auVar133,0x10);
            auVar167 = vblendvps_avx(auVar167,auVar72,auVar117);
            auVar141 = vshufps_avx(auVar167,auVar167,0xe1);
            auVar167 = vcmpps_avx(auVar72,auVar141,1);
            if ((auVar167 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              auVar141 = vinsertps_avx(auVar141,auVar72,0x50);
            }
            break;
          case 4:
            auVar122._8_4_ = 0x42b0c0a5;
            auVar122._0_8_ = 0x42b0c0a542b0c0a5;
            auVar122._12_4_ = 0x42b0c0a5;
            auVar117 = vminps_avx(auVar141,auVar122);
            auVar84._8_4_ = 0xc2b0c0a5;
            auVar84._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar84._12_4_ = 0xc2b0c0a5;
            auVar167 = vcmpps_avx(auVar117,auVar84,1);
            auVar73._0_8_ = auVar117._0_8_ ^ 0x8000000080000000;
            auVar73._8_4_ = auVar117._8_4_ ^ 0x80000000;
            auVar73._12_4_ = auVar117._12_4_ ^ 0x80000000;
            auVar167 = vblendvps_avx(auVar73,auVar122,auVar167);
            in_ZMM4 = ZEXT1664(auVar139);
            local_1c8._0_4_ = expf(auVar167._0_4_);
            local_1c8._4_4_ = extraout_XMM0_Db_00;
            local_1c8._8_4_ = extraout_XMM0_Dc_00;
            local_1c8._12_4_ = extraout_XMM0_Dd_00;
            auVar167 = vmovshdup_avx(auVar167);
            auVar76._0_4_ = expf(auVar167._0_4_);
            auVar76._4_60_ = extraout_var_00;
            auVar167 = vinsertps_avx(local_1c8,auVar76._0_16_,0x10);
            auVar85._8_4_ = 0x3f800000;
            auVar85._0_8_ = 0x3f8000003f800000;
            auVar85._12_4_ = 0x3f800000;
            auVar74._0_4_ = auVar167._0_4_ + 1.0;
            auVar74._4_4_ = auVar167._4_4_ + 1.0;
            auVar74._8_4_ = auVar167._8_4_ + 1.0;
            auVar74._12_4_ = auVar167._12_4_ + 1.0;
            auVar141 = vdivps_avx(auVar85,auVar74);
            break;
          case 5:
            in_ZMM4 = ZEXT1664(auVar139);
            fVar149 = expf(fVar203);
            fVar149 = logf(fVar149 + 1.0);
            local_1b8._0_4_ = tanhf(fVar149);
            local_1b8._4_4_ = extraout_XMM0_Db;
            local_1b8._8_4_ = extraout_XMM0_Dc;
            local_1b8._12_4_ = extraout_XMM0_Dd;
            fVar148 = expf(fVar148);
            fVar148 = logf(fVar148 + 1.0);
            auVar180._0_4_ = tanhf(fVar148);
            auVar180._4_60_ = extraout_var;
            auVar167 = vinsertps_avx(local_1b8,auVar180._0_16_,0x10);
LAB_004e2db6:
            auVar141._0_4_ = auVar167._0_4_ * fVar203;
            auVar141._4_4_ = auVar167._4_4_ * auVar76._4_4_;
            auVar141._8_4_ = auVar167._8_4_ * auVar76._8_4_;
            auVar141._12_4_ = auVar167._12_4_ * auVar76._12_4_;
            break;
          case 6:
            fVar149 = *pfVar51;
            fVar196 = pfVar51[1];
            fVar197 = -fVar196 / fVar149;
            auVar167 = SUB6416(ZEXT464(0),0) << 0x20;
            if ((fVar197 <= fVar203) && (auVar167 = auVar141, fVar203 <= fVar197 + 1.0 / fVar149)) {
              auVar167 = ZEXT416((uint)((fVar149 * fVar203 + fVar196) * fVar203));
            }
            if (fVar197 <= fVar148) {
              in_ZMM4 = ZEXT1664(CONCAT124(SUB6012((undefined1  [60])0x0,0),1.0 / fVar149));
              auVar141._4_12_ = auVar76._4_12_;
              auVar141._0_4_ = (float)auVar167._0_4_;
              if (fVar148 <= fVar197 + 1.0 / fVar149) {
                auVar141 = vinsertps_avx(auVar141,ZEXT416((uint)((fVar149 * fVar148 + fVar196) *
                                                                fVar148)),0x10);
              }
            }
            else {
              auVar141 = vblendps_avx(auVar167,_DAT_005442b0,0xe);
            }
          }
LAB_004e2dc8:
          *puVar63 = auVar141._0_4_;
          uVar11 = vextractps_avx(auVar141,1);
          *puVar67 = uVar11;
          puVar63 = puVar63 + 1;
          puVar67 = puVar67 + 1;
          iVar48 = iVar48 + iVar39;
          lVar61 = lVar61 + lVar1;
          lVar42 = lVar42 + lVar1;
        }
      }
      lVar40 = lVar40 * lVar46;
      pvVar13 = top_blob->data;
      iVar39 = top_blob->w;
      sVar14 = top_blob->elemsize;
      local_190 = 0;
      uVar30 = 0;
      if (0 < (int)local_38) {
        uVar30 = local_38 & 0xffffffff;
      }
      for (uVar56 = (ulong)(iVar49 + iVar50 * 2); (long)uVar56 < (long)uVar29; uVar56 = uVar56 + 1)
      {
        uVar45 = (int)uVar56 >> 0x1f;
        uVar53 = (ulong)uVar45 << 0x20 | uVar56 & 0xffffffff;
        sVar15 = (this->weight_data_tm).cstep;
        sVar17 = (this->weight_data_tm).elemsize;
        pfVar65 = (float *)((long)iVar39 * sVar14 * uVar56 + (long)pvVar13);
        pvVar16 = (this->weight_data_tm).data;
        pfVar51 = (float *)(this->super_Convolution1D).activation_params.data;
        lVar55 = 0;
        iVar50 = 0;
        lVar46 = lVar47 * 4;
        for (uVar66 = 0; uVar66 != uVar30; uVar66 = uVar66 + 1) {
          if (pvVar12 == (void *)0x0) {
            fVar203 = 0.0;
          }
          else {
            fVar203 = *(float *)((long)pvVar12 + uVar56 * 4);
          }
          iVar49 = iVar9 * iVar7 * (int)uVar66;
          lVar61 = (long)local_88.w *
                   CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize);
          lVar60 = (long)local_88.data + lVar46;
          pfVar36 = (float *)((long)local_88.data + lVar55);
          fVar148 = 0.0;
          fVar149 = 0.0;
          fVar196 = 0.0;
          fVar197 = 0.0;
          fVar198 = 0.0;
          fVar199 = 0.0;
          fVar200 = 0.0;
          fVar201 = 0.0;
          uVar54 = 0;
          pfVar32 = (float *)((long)((int)((long)((ulong)uVar45 << 0x20 | uVar56 & 0xffffffff) % 2)
                                     + (int)((long)uVar53 / 8) +
                                     (int)(char)((char)((long)uVar53 % 8) / '\x04') +
                                    (int)(char)((char)((long)((ulong)uVar45 << 0x20 |
                                                             uVar56 & 0xffffffff) % 4) / '\x02')) *
                              sVar15 * sVar17 + (long)pvVar16);
          while( true ) {
            local_138 = (int)lVar40;
            if (local_138 <= (int)((uint)uVar54 | 7)) break;
            lVar42 = (int)((long)((ulong)(uint)((int)(uint)uVar54 >> 0x1f) << 0x20 |
                                 uVar54 & 0xffffffff) / (long)iVar7) * lVar61;
            if (iVar7 == 8) {
              pfVar37 = (float *)((long)local_88.data + lVar42 + (long)iVar50 * 4);
              uVar62 = uVar69;
              pfVar58 = pfVar32;
              while (iVar48 = (int)uVar62, uVar62 = (ulong)(iVar48 - 1), iVar48 != 0) {
                fVar196 = *pfVar58 * *pfVar37 + fVar196;
                fVar197 = pfVar58[1] * pfVar37[1] + fVar197;
                fVar148 = pfVar58[2] * pfVar37[2] + fVar148;
                fVar149 = pfVar58[3] * pfVar37[3] + fVar149;
                fVar198 = pfVar58[4] * pfVar37[4] + fVar198;
                fVar199 = pfVar58[5] * pfVar37[5] + fVar199;
                fVar200 = pfVar58[6] * pfVar37[6] + fVar200;
                fVar201 = pfVar58[7] + fVar201;
                pfVar58 = pfVar58 + 8;
                pfVar37 = pfVar37 + iVar25;
              }
              pfVar32 = pfVar32 + uVar69 * 8;
            }
            else {
              pfVar37 = (float *)((long)local_88.data + lVar42 + (long)iVar49 * 4);
            }
            uVar62 = uVar69;
            pfVar58 = pfVar37;
            pfVar64 = pfVar32;
            if (iVar7 == 4) {
              while ((int)uVar62 != 0) {
                fVar196 = *pfVar58 * *pfVar64 + fVar196;
                fVar197 = pfVar58[1] * pfVar64[1] + fVar197;
                fVar148 = pfVar58[2] * pfVar64[2] + fVar148;
                fVar149 = pfVar58[3] * pfVar64[3] + fVar149;
                fVar198 = pfVar58[lVar47 + 4] * pfVar64[4] + fVar198;
                fVar199 = pfVar58[lVar47 + 5] * pfVar64[5] + fVar199;
                fVar200 = pfVar58[lVar47 + 6] * pfVar64[6] + fVar200;
                fVar201 = pfVar58[lVar47 + 7] + fVar201;
                uVar62 = (ulong)((int)uVar62 - 1);
                pfVar58 = pfVar58 + lVar41;
                pfVar64 = pfVar64 + 8;
              }
              pfVar32 = pfVar32 + uVar69 * 8;
              pfVar37 = (float *)((long)pfVar37 + lVar59);
            }
            uVar62 = uVar69;
            pfVar58 = pfVar32;
            if (iVar7 == 1) {
              while ((int)uVar62 != 0) {
                auVar167 = vinsertps_avx(ZEXT416((uint)*pfVar37),ZEXT416((uint)pfVar37[lVar47]),0x10
                                        );
                auVar167 = vinsertps_avx(auVar167,ZEXT416((uint)pfVar37[iVar22]),0x20);
                auVar167 = vinsertps_avx(auVar167,ZEXT416((uint)pfVar37[iVar8]),0x30);
                auVar117 = vinsertps_avx(ZEXT416((uint)pfVar37[iVar26]),
                                         ZEXT416((uint)pfVar37[iVar18]),0x10);
                auVar117 = vinsertps_avx(auVar117,ZEXT416((uint)pfVar37[iVar27]),0x20);
                auVar117 = vinsertps_avx(auVar117,ZEXT416((uint)pfVar37[iVar38]),0x30);
                fVar196 = auVar167._0_4_ * *pfVar58 + fVar196;
                fVar197 = auVar167._4_4_ * pfVar58[1] + fVar197;
                fVar148 = auVar167._8_4_ * pfVar58[2] + fVar148;
                fVar149 = auVar167._12_4_ * pfVar58[3] + fVar149;
                fVar198 = auVar117._0_4_ * pfVar58[4] + fVar198;
                fVar199 = auVar117._4_4_ * pfVar58[5] + fVar199;
                fVar200 = auVar117._8_4_ * pfVar58[6] + fVar200;
                fVar201 = auVar117._12_4_ + fVar201;
                pfVar37 = pfVar37 + lVar70;
                uVar62 = (ulong)((int)uVar62 - 1);
                pfVar58 = pfVar58 + 8;
              }
              pfVar32 = pfVar32 + uVar69 * 8;
            }
            uVar54 = uVar54 + 8;
            lVar60 = lVar60 + lVar61 * 8;
            pfVar36 = pfVar36 + lVar61 * 2;
          }
          auVar87._0_4_ = fVar198 + fVar196;
          auVar87._4_4_ = fVar199 + fVar197;
          auVar87._8_4_ = fVar200 + fVar148;
          auVar87._12_4_ = fVar201 + fVar149;
          auVar167 = vshufpd_avx(auVar87,auVar87,1);
          auVar88._0_4_ = auVar167._0_4_ + auVar87._0_4_;
          auVar88._4_4_ = auVar167._4_4_ + auVar87._4_4_;
          auVar88._8_4_ = auVar167._8_4_ + auVar87._8_4_;
          auVar88._12_4_ = auVar167._12_4_ + auVar87._12_4_;
          auVar76 = ZEXT864(0) << 0x40;
          for (; (int)((uint)uVar54 | 3) < local_138; uVar54 = uVar54 + 4) {
            lVar42 = (int)((long)((ulong)(uint)((int)(uint)uVar54 >> 0x1f) << 0x20 |
                                 uVar54 & 0xffffffff) / (long)iVar7) * lVar61;
            if (iVar7 == 4) {
              pfVar37 = (float *)((long)local_88.data + lVar42 + (long)iVar50 * 4);
              uVar62 = uVar69;
              pfVar58 = pfVar32;
              while (iVar48 = (int)uVar62, uVar62 = (ulong)(iVar48 - 1), iVar48 != 0) {
                auVar76 = ZEXT1664(CONCAT412(pfVar58[3] * pfVar37[3] + auVar76._12_4_,
                                             CONCAT48(pfVar58[2] * pfVar37[2] + auVar76._8_4_,
                                                      CONCAT44(pfVar58[1] * pfVar37[1] +
                                                               auVar76._4_4_,
                                                               *pfVar58 * *pfVar37 + auVar76._0_4_))
                                            ));
                pfVar58 = pfVar58 + 4;
                pfVar37 = pfVar37 + lVar41;
              }
              pfVar32 = pfVar32 + uVar69 * 4;
            }
            else {
              pfVar37 = (float *)((long)local_88.data + lVar42 + (long)iVar49 * 4);
            }
            uVar62 = uVar69;
            pfVar58 = pfVar32;
            if (iVar7 == 1) {
              while ((int)uVar62 != 0) {
                auVar167 = vinsertps_avx(ZEXT416((uint)*pfVar37),ZEXT416((uint)pfVar37[lVar47]),0x10
                                        );
                auVar167 = vinsertps_avx(auVar167,ZEXT416((uint)pfVar37[iVar22]),0x20);
                auVar167 = vinsertps_avx(auVar167,ZEXT416((uint)pfVar37[iVar8]),0x30);
                auVar76 = ZEXT1664(CONCAT412(auVar167._12_4_ * pfVar58[3] + auVar76._12_4_,
                                             CONCAT48(auVar167._8_4_ * pfVar58[2] + auVar76._8_4_,
                                                      CONCAT44(auVar167._4_4_ * pfVar58[1] +
                                                               auVar76._4_4_,
                                                               auVar167._0_4_ * *pfVar58 +
                                                               auVar76._0_4_))));
                pfVar37 = pfVar37 + lVar70;
                uVar62 = (ulong)((int)uVar62 - 1);
                pfVar58 = pfVar58 + 4;
              }
              pfVar32 = pfVar32 + uVar69 * 4;
            }
            lVar60 = lVar60 + lVar61 * 4;
            pfVar36 = pfVar36 + lVar61;
          }
          auVar167 = vmovshdup_avx(auVar88);
          auVar117 = vshufpd_avx(auVar76._0_16_,auVar76._0_16_,1);
          auVar104._0_4_ = auVar117._0_4_ + auVar76._0_4_;
          auVar104._4_4_ = auVar117._4_4_ + auVar76._4_4_;
          auVar104._8_4_ = auVar117._8_4_ + auVar76._8_4_;
          auVar104._12_4_ = auVar117._12_4_ + auVar76._12_4_;
          auVar117 = vmovshdup_avx(auVar104);
          auVar76 = ZEXT464((uint)(auVar167._0_4_ + fVar203 + auVar88._0_4_ +
                                  auVar117._0_4_ + auVar104._0_4_));
          for (; (long)(uVar54 | 1) < lVar40; uVar54 = uVar54 + 2) {
            lVar42 = 0;
            for (lVar31 = 0; iVar68 != (int)lVar31; lVar31 = lVar31 + 1) {
              auVar76 = ZEXT464((uint)(pfVar32[lVar31 * 2] * *(float *)((long)pfVar36 + lVar42) +
                                       auVar76._0_4_ +
                                      pfVar32[lVar31 * 2 + 1] * *(float *)(lVar60 + lVar42)));
              lVar42 = lVar42 + lVar71;
            }
            pfVar32 = pfVar32 + uVar69 * 2;
            lVar60 = lVar60 + lVar61 * 2;
            pfVar36 = (float *)((long)pfVar36 + lVar61 * 2);
          }
          for (; (long)uVar54 < lVar40; uVar54 = uVar54 + 1) {
            pfVar37 = pfVar36;
            for (lVar60 = 0; iVar68 != (int)lVar60; lVar60 = lVar60 + 1) {
              auVar76 = ZEXT464((uint)(pfVar32[lVar60] * *pfVar37 + auVar76._0_4_));
              pfVar37 = pfVar37 + lVar70;
            }
            pfVar32 = pfVar32 + uVar69;
            pfVar36 = (float *)((long)pfVar36 + lVar61);
          }
          auVar167 = auVar76._0_16_;
          fVar148 = auVar76._0_4_;
          fVar203 = fVar148;
          switch(iVar10) {
          case 1:
            auVar167 = vmaxss_avx(auVar167,ZEXT416(0));
            fVar203 = auVar167._0_4_;
            break;
          case 2:
            auVar167 = vcmpss_avx(ZEXT416(0) << 0x20,auVar167,1);
            auVar106._8_4_ = 0x3f800000;
            auVar106._0_8_ = 0x3f8000003f800000;
            auVar106._12_4_ = 0x3f800000;
            auVar167 = vblendvps_avx(ZEXT416((uint)*pfVar51),auVar106,auVar167);
            fVar203 = auVar167._0_4_ * fVar148;
            break;
          case 3:
            auVar167 = vmaxss_avx(auVar167,ZEXT416((uint)*pfVar51));
            fVar203 = auVar167._0_4_;
            if (pfVar51[1] < auVar167._0_4_) {
              fVar203 = pfVar51[1];
            }
            break;
          case 4:
            auVar167 = vminss_avx(auVar167,ZEXT416(0x42b0c0a5));
            auVar89._0_8_ = auVar167._0_8_ ^ 0x8000000080000000;
            auVar89._8_4_ = auVar167._8_4_ ^ 0x80000000;
            auVar89._12_4_ = auVar167._12_4_ ^ 0x80000000;
            auVar167 = vcmpss_avx(auVar167,ZEXT416(0xc2b0c0a5),1);
            auVar105._8_4_ = 0x42b0c0a5;
            auVar105._0_8_ = 0x42b0c0a542b0c0a5;
            auVar105._12_4_ = 0x42b0c0a5;
            auVar167 = vblendvps_avx(auVar89,auVar105,auVar167);
            fVar203 = expf(auVar167._0_4_);
            fVar203 = 1.0 / (fVar203 + 1.0);
            break;
          case 5:
            fVar203 = expf(fVar148);
            fVar203 = logf(fVar203 + 1.0);
            fVar203 = tanhf(fVar203);
            fVar203 = fVar203 * fVar148;
            break;
          case 6:
            fVar149 = *pfVar51;
            fVar196 = -pfVar51[1] / fVar149;
            fVar203 = 0.0;
            if ((fVar196 <= fVar148) && (fVar203 = fVar148, fVar148 <= fVar196 + 1.0 / fVar149)) {
              fVar203 = (fVar149 * fVar148 + pfVar51[1]) * fVar148;
            }
          }
          *pfVar65 = fVar203;
          pfVar65 = pfVar65 + 1;
          iVar50 = iVar50 + iVar9 * iVar7;
          lVar46 = lVar46 + lVar1;
          lVar55 = lVar55 + lVar1;
        }
      }
    }
  }
  piVar23 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
  if (piVar23 != (int *)0x0) {
    LOCK();
    *piVar23 = *piVar23 + -1;
    UNLOCK();
    if (*piVar23 == 0) {
      if (local_88.allocator == (Allocator *)0x0) {
        free(local_88.data);
      }
      else {
        (*(local_88.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return local_190;
}

Assistant:

int Convolution1D_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    convolution1d_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, dilation_w, stride_w, activation_type, activation_params, opt);

    return 0;
}